

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<8,8>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Primitive PVar5;
  uint uVar6;
  uint uVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  void *pvVar10;
  __int_type_conflict _Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  byte bVar34;
  uint uVar35;
  ulong uVar36;
  long lVar38;
  uint uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  uint uVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  undefined1 auVar103 [32];
  undefined1 auVar105 [32];
  float fVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar112;
  float fVar113;
  float fVar114;
  float t1;
  undefined4 uVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar124;
  float fVar125;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar133;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  vfloat4 b0;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  vfloat4 b0_1;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  vfloat4 a0_2;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar200;
  float fVar209;
  float fVar210;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar211;
  float fVar222;
  float fVar223;
  vfloat4 a0_1;
  undefined1 auVar212 [16];
  float fVar224;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar225;
  float fVar230;
  float fVar231;
  vfloat4 a0;
  float fVar232;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [32];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  RTCFilterFunctionNArguments local_480;
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  uint auStack_430 [4];
  undefined1 local_420 [32];
  undefined1 local_3f0 [8];
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [8];
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [16];
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [8];
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined8 uStack_240;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar37;
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar104 [32];
  undefined1 auVar106 [32];
  undefined1 auVar237 [32];
  
  PVar5 = prim[1];
  uVar42 = (ulong)(byte)PVar5;
  fVar125 = *(float *)(prim + uVar42 * 0x19 + 0x12);
  auVar48 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar48 = vinsertps_avx(auVar48,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar58 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar50 = vinsertps_avx(auVar58,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar116 = vsubps_avx(auVar48,*(undefined1 (*) [16])(prim + uVar42 * 0x19 + 6));
  fVar124 = fVar125 * auVar116._0_4_;
  fVar107 = fVar125 * auVar50._0_4_;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar42 * 4 + 6);
  auVar79 = vpmovsxbd_avx2(auVar48);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar42 * 5 + 6);
  auVar77 = vpmovsxbd_avx2(auVar58);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar42 * 6 + 6);
  auVar80 = vpmovsxbd_avx2(auVar3);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar42 * 0xb + 6);
  auVar90 = vpmovsxbd_avx2(auVar57);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6);
  auVar84 = vpmovsxbd_avx2(auVar56);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar91 = vcvtdq2ps_avx(auVar84);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + (uint)(byte)PVar5 * 0xc + uVar42 + 6);
  auVar78 = vpmovsxbd_avx2(auVar55);
  auVar78 = vcvtdq2ps_avx(auVar78);
  uVar41 = (ulong)(uint)((int)(uVar42 * 9) * 2);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + uVar41 + 6);
  auVar81 = vpmovsxbd_avx2(auVar59);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar41 + uVar42 + 6);
  auVar82 = vpmovsxbd_avx2(auVar54);
  auVar82 = vcvtdq2ps_avx(auVar82);
  uVar36 = (ulong)(uint)((int)(uVar42 * 5) << 2);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar36 + 6);
  auVar76 = vpmovsxbd_avx2(auVar4);
  auVar83 = vcvtdq2ps_avx(auVar76);
  auVar150._4_4_ = fVar107;
  auVar150._0_4_ = fVar107;
  auVar150._8_4_ = fVar107;
  auVar150._12_4_ = fVar107;
  auVar150._16_4_ = fVar107;
  auVar150._20_4_ = fVar107;
  auVar150._24_4_ = fVar107;
  auVar150._28_4_ = fVar107;
  auVar243._8_4_ = 1;
  auVar243._0_8_ = 0x100000001;
  auVar243._12_4_ = 1;
  auVar243._16_4_ = 1;
  auVar243._20_4_ = 1;
  auVar243._24_4_ = 1;
  auVar243._28_4_ = 1;
  auVar74 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar251 = ZEXT3264(auVar74);
  auVar86 = ZEXT1632(CONCAT412(fVar125 * auVar50._12_4_,
                               CONCAT48(fVar125 * auVar50._8_4_,
                                        CONCAT44(fVar125 * auVar50._4_4_,fVar107))));
  auVar85 = vpermps_avx2(auVar243,auVar86);
  auVar75 = vpermps_avx512vl(auVar74,auVar86);
  fVar107 = auVar75._0_4_;
  fVar200 = auVar75._4_4_;
  auVar86._4_4_ = fVar200 * auVar80._4_4_;
  auVar86._0_4_ = fVar107 * auVar80._0_4_;
  fVar209 = auVar75._8_4_;
  auVar86._8_4_ = fVar209 * auVar80._8_4_;
  fVar210 = auVar75._12_4_;
  auVar86._12_4_ = fVar210 * auVar80._12_4_;
  fVar112 = auVar75._16_4_;
  auVar86._16_4_ = fVar112 * auVar80._16_4_;
  fVar113 = auVar75._20_4_;
  auVar86._20_4_ = fVar113 * auVar80._20_4_;
  fVar114 = auVar75._24_4_;
  auVar86._24_4_ = fVar114 * auVar80._24_4_;
  auVar86._28_4_ = auVar84._28_4_;
  auVar84._4_4_ = auVar78._4_4_ * fVar200;
  auVar84._0_4_ = auVar78._0_4_ * fVar107;
  auVar84._8_4_ = auVar78._8_4_ * fVar209;
  auVar84._12_4_ = auVar78._12_4_ * fVar210;
  auVar84._16_4_ = auVar78._16_4_ * fVar112;
  auVar84._20_4_ = auVar78._20_4_ * fVar113;
  auVar84._24_4_ = auVar78._24_4_ * fVar114;
  auVar84._28_4_ = auVar76._28_4_;
  auVar76._4_4_ = auVar83._4_4_ * fVar200;
  auVar76._0_4_ = auVar83._0_4_ * fVar107;
  auVar76._8_4_ = auVar83._8_4_ * fVar209;
  auVar76._12_4_ = auVar83._12_4_ * fVar210;
  auVar76._16_4_ = auVar83._16_4_ * fVar112;
  auVar76._20_4_ = auVar83._20_4_ * fVar113;
  auVar76._24_4_ = auVar83._24_4_ * fVar114;
  auVar76._28_4_ = auVar75._28_4_;
  auVar48 = vfmadd231ps_fma(auVar86,auVar85,auVar77);
  auVar58 = vfmadd231ps_fma(auVar84,auVar85,auVar91);
  auVar3 = vfmadd231ps_fma(auVar76,auVar82,auVar85);
  auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar150,auVar79);
  auVar58 = vfmadd231ps_fma(ZEXT1632(auVar58),auVar150,auVar90);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar81,auVar150);
  auVar229._4_4_ = fVar124;
  auVar229._0_4_ = fVar124;
  auVar229._8_4_ = fVar124;
  auVar229._12_4_ = fVar124;
  auVar229._16_4_ = fVar124;
  auVar229._20_4_ = fVar124;
  auVar229._24_4_ = fVar124;
  auVar229._28_4_ = fVar124;
  auVar76 = ZEXT1632(CONCAT412(fVar125 * auVar116._12_4_,
                               CONCAT48(fVar125 * auVar116._8_4_,
                                        CONCAT44(fVar125 * auVar116._4_4_,fVar124))));
  auVar84 = vpermps_avx2(auVar243,auVar76);
  auVar76 = vpermps_avx512vl(auVar74,auVar76);
  fVar125 = auVar76._0_4_;
  fVar107 = auVar76._4_4_;
  auVar85._4_4_ = fVar107 * auVar80._4_4_;
  auVar85._0_4_ = fVar125 * auVar80._0_4_;
  fVar200 = auVar76._8_4_;
  auVar85._8_4_ = fVar200 * auVar80._8_4_;
  fVar209 = auVar76._12_4_;
  auVar85._12_4_ = fVar209 * auVar80._12_4_;
  fVar210 = auVar76._16_4_;
  auVar85._16_4_ = fVar210 * auVar80._16_4_;
  fVar112 = auVar76._20_4_;
  auVar85._20_4_ = fVar112 * auVar80._20_4_;
  fVar113 = auVar76._24_4_;
  auVar85._24_4_ = fVar113 * auVar80._24_4_;
  auVar85._28_4_ = 1;
  auVar74._4_4_ = auVar78._4_4_ * fVar107;
  auVar74._0_4_ = auVar78._0_4_ * fVar125;
  auVar74._8_4_ = auVar78._8_4_ * fVar200;
  auVar74._12_4_ = auVar78._12_4_ * fVar209;
  auVar74._16_4_ = auVar78._16_4_ * fVar210;
  auVar74._20_4_ = auVar78._20_4_ * fVar112;
  auVar74._24_4_ = auVar78._24_4_ * fVar113;
  auVar74._28_4_ = auVar80._28_4_;
  auVar78._4_4_ = auVar83._4_4_ * fVar107;
  auVar78._0_4_ = auVar83._0_4_ * fVar125;
  auVar78._8_4_ = auVar83._8_4_ * fVar200;
  auVar78._12_4_ = auVar83._12_4_ * fVar209;
  auVar78._16_4_ = auVar83._16_4_ * fVar210;
  auVar78._20_4_ = auVar83._20_4_ * fVar112;
  auVar78._24_4_ = auVar83._24_4_ * fVar113;
  auVar78._28_4_ = auVar76._28_4_;
  auVar57 = vfmadd231ps_fma(auVar85,auVar84,auVar77);
  auVar56 = vfmadd231ps_fma(auVar74,auVar84,auVar91);
  auVar55 = vfmadd231ps_fma(auVar78,auVar84,auVar82);
  auVar57 = vfmadd231ps_fma(ZEXT1632(auVar57),auVar229,auVar79);
  auVar56 = vfmadd231ps_fma(ZEXT1632(auVar56),auVar229,auVar90);
  auVar93._8_4_ = 0x7fffffff;
  auVar93._0_8_ = 0x7fffffff7fffffff;
  auVar93._12_4_ = 0x7fffffff;
  auVar93._16_4_ = 0x7fffffff;
  auVar93._20_4_ = 0x7fffffff;
  auVar93._24_4_ = 0x7fffffff;
  auVar93._28_4_ = 0x7fffffff;
  auVar55 = vfmadd231ps_fma(ZEXT1632(auVar55),auVar229,auVar81);
  auVar79 = vandps_avx(ZEXT1632(auVar48),auVar93);
  auVar137._8_4_ = 0x219392ef;
  auVar137._0_8_ = 0x219392ef219392ef;
  auVar137._12_4_ = 0x219392ef;
  auVar137._16_4_ = 0x219392ef;
  auVar137._20_4_ = 0x219392ef;
  auVar137._24_4_ = 0x219392ef;
  auVar137._28_4_ = 0x219392ef;
  uVar41 = vcmpps_avx512vl(auVar79,auVar137,1);
  bVar46 = (bool)((byte)uVar41 & 1);
  auVar75._0_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar48._0_4_;
  bVar46 = (bool)((byte)(uVar41 >> 1) & 1);
  auVar75._4_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar48._4_4_;
  bVar46 = (bool)((byte)(uVar41 >> 2) & 1);
  auVar75._8_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar48._8_4_;
  bVar46 = (bool)((byte)(uVar41 >> 3) & 1);
  auVar75._12_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar48._12_4_;
  auVar75._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * 0x219392ef;
  auVar75._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * 0x219392ef;
  auVar75._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * 0x219392ef;
  auVar75._28_4_ = (uint)(byte)(uVar41 >> 7) * 0x219392ef;
  auVar79 = vandps_avx(ZEXT1632(auVar58),auVar93);
  uVar41 = vcmpps_avx512vl(auVar79,auVar137,1);
  bVar46 = (bool)((byte)uVar41 & 1);
  auVar87._0_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar58._0_4_;
  bVar46 = (bool)((byte)(uVar41 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar58._4_4_;
  bVar46 = (bool)((byte)(uVar41 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar58._8_4_;
  bVar46 = (bool)((byte)(uVar41 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar58._12_4_;
  auVar87._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * 0x219392ef;
  auVar87._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * 0x219392ef;
  auVar87._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * 0x219392ef;
  auVar87._28_4_ = (uint)(byte)(uVar41 >> 7) * 0x219392ef;
  auVar79 = vandps_avx(ZEXT1632(auVar3),auVar93);
  uVar41 = vcmpps_avx512vl(auVar79,auVar137,1);
  bVar46 = (bool)((byte)uVar41 & 1);
  auVar79._0_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar3._0_4_;
  bVar46 = (bool)((byte)(uVar41 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar3._4_4_;
  bVar46 = (bool)((byte)(uVar41 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar3._8_4_;
  bVar46 = (bool)((byte)(uVar41 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar3._12_4_;
  auVar79._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * 0x219392ef;
  auVar79._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * 0x219392ef;
  auVar79._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * 0x219392ef;
  auVar79._28_4_ = (uint)(byte)(uVar41 >> 7) * 0x219392ef;
  auVar77 = vrcp14ps_avx512vl(auVar75);
  auVar94._8_4_ = 0x3f800000;
  auVar94._0_8_ = 0x3f8000003f800000;
  auVar94._12_4_ = 0x3f800000;
  auVar94._16_4_ = 0x3f800000;
  auVar94._20_4_ = 0x3f800000;
  auVar94._24_4_ = 0x3f800000;
  auVar94._28_4_ = 0x3f800000;
  auVar48 = vfnmadd213ps_fma(auVar75,auVar77,auVar94);
  auVar48 = vfmadd132ps_fma(ZEXT1632(auVar48),auVar77,auVar77);
  auVar77 = vrcp14ps_avx512vl(auVar87);
  auVar58 = vfnmadd213ps_fma(auVar87,auVar77,auVar94);
  auVar58 = vfmadd132ps_fma(ZEXT1632(auVar58),auVar77,auVar77);
  auVar77 = vrcp14ps_avx512vl(auVar79);
  auVar3 = vfnmadd213ps_fma(auVar79,auVar77,auVar94);
  auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar77,auVar77);
  auVar79 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar42 * 7 + 6));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar79 = vsubps_avx(auVar79,ZEXT1632(auVar57));
  auVar81._4_4_ = auVar48._4_4_ * auVar79._4_4_;
  auVar81._0_4_ = auVar48._0_4_ * auVar79._0_4_;
  auVar81._8_4_ = auVar48._8_4_ * auVar79._8_4_;
  auVar81._12_4_ = auVar48._12_4_ * auVar79._12_4_;
  auVar81._16_4_ = auVar79._16_4_ * 0.0;
  auVar81._20_4_ = auVar79._20_4_ * 0.0;
  auVar81._24_4_ = auVar79._24_4_ * 0.0;
  auVar81._28_4_ = auVar79._28_4_;
  auVar79 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar42 * 9 + 6));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar79 = vsubps_avx(auVar79,ZEXT1632(auVar57));
  auVar78 = vpbroadcastd_avx512vl();
  auVar77 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar5 * 0x10 + 6));
  auVar92._0_4_ = auVar48._0_4_ * auVar79._0_4_;
  auVar92._4_4_ = auVar48._4_4_ * auVar79._4_4_;
  auVar92._8_4_ = auVar48._8_4_ * auVar79._8_4_;
  auVar92._12_4_ = auVar48._12_4_ * auVar79._12_4_;
  auVar92._16_4_ = auVar79._16_4_ * 0.0;
  auVar92._20_4_ = auVar79._20_4_ * 0.0;
  auVar92._24_4_ = auVar79._24_4_ * 0.0;
  auVar92._28_4_ = 0;
  auVar79 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar5 * 0x10 + uVar42 * -2 + 6));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar79 = vsubps_avx(auVar79,ZEXT1632(auVar56));
  auVar82._4_4_ = auVar58._4_4_ * auVar79._4_4_;
  auVar82._0_4_ = auVar58._0_4_ * auVar79._0_4_;
  auVar82._8_4_ = auVar58._8_4_ * auVar79._8_4_;
  auVar82._12_4_ = auVar58._12_4_ * auVar79._12_4_;
  auVar82._16_4_ = auVar79._16_4_ * 0.0;
  auVar82._20_4_ = auVar79._20_4_ * 0.0;
  auVar82._24_4_ = auVar79._24_4_ * 0.0;
  auVar82._28_4_ = auVar79._28_4_;
  auVar79 = vcvtdq2ps_avx(auVar77);
  auVar79 = vsubps_avx(auVar79,ZEXT1632(auVar56));
  auVar89._0_4_ = auVar58._0_4_ * auVar79._0_4_;
  auVar89._4_4_ = auVar58._4_4_ * auVar79._4_4_;
  auVar89._8_4_ = auVar58._8_4_ * auVar79._8_4_;
  auVar89._12_4_ = auVar58._12_4_ * auVar79._12_4_;
  auVar89._16_4_ = auVar79._16_4_ * 0.0;
  auVar89._20_4_ = auVar79._20_4_ * 0.0;
  auVar89._24_4_ = auVar79._24_4_ * 0.0;
  auVar89._28_4_ = 0;
  auVar79 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar36 + uVar42 + 6));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar79 = vsubps_avx(auVar79,ZEXT1632(auVar55));
  auVar83._4_4_ = auVar79._4_4_ * auVar3._4_4_;
  auVar83._0_4_ = auVar79._0_4_ * auVar3._0_4_;
  auVar83._8_4_ = auVar79._8_4_ * auVar3._8_4_;
  auVar83._12_4_ = auVar79._12_4_ * auVar3._12_4_;
  auVar83._16_4_ = auVar79._16_4_ * 0.0;
  auVar83._20_4_ = auVar79._20_4_ * 0.0;
  auVar83._24_4_ = auVar79._24_4_ * 0.0;
  auVar83._28_4_ = auVar79._28_4_;
  auVar79 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar42 * 0x17 + 6));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar79 = vsubps_avx(auVar79,ZEXT1632(auVar55));
  auVar88._0_4_ = auVar3._0_4_ * auVar79._0_4_;
  auVar88._4_4_ = auVar3._4_4_ * auVar79._4_4_;
  auVar88._8_4_ = auVar3._8_4_ * auVar79._8_4_;
  auVar88._12_4_ = auVar3._12_4_ * auVar79._12_4_;
  auVar88._16_4_ = auVar79._16_4_ * 0.0;
  auVar88._20_4_ = auVar79._20_4_ * 0.0;
  auVar88._24_4_ = auVar79._24_4_ * 0.0;
  auVar88._28_4_ = 0;
  auVar79 = vpminsd_avx2(auVar81,auVar92);
  auVar77 = vpminsd_avx2(auVar82,auVar89);
  auVar79 = vmaxps_avx(auVar79,auVar77);
  auVar77 = vpminsd_avx2(auVar83,auVar88);
  uVar115 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar80._4_4_ = uVar115;
  auVar80._0_4_ = uVar115;
  auVar80._8_4_ = uVar115;
  auVar80._12_4_ = uVar115;
  auVar80._16_4_ = uVar115;
  auVar80._20_4_ = uVar115;
  auVar80._24_4_ = uVar115;
  auVar80._28_4_ = uVar115;
  auVar77 = vmaxps_avx512vl(auVar77,auVar80);
  auVar79 = vmaxps_avx(auVar79,auVar77);
  auVar77._8_4_ = 0x3f7ffffa;
  auVar77._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar77._12_4_ = 0x3f7ffffa;
  auVar77._16_4_ = 0x3f7ffffa;
  auVar77._20_4_ = 0x3f7ffffa;
  auVar77._24_4_ = 0x3f7ffffa;
  auVar77._28_4_ = 0x3f7ffffa;
  local_1c0 = vmulps_avx512vl(auVar79,auVar77);
  auVar79 = vpmaxsd_avx2(auVar81,auVar92);
  auVar77 = vpmaxsd_avx2(auVar82,auVar89);
  auVar79 = vminps_avx(auVar79,auVar77);
  auVar77 = vpmaxsd_avx2(auVar83,auVar88);
  uVar115 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar90._4_4_ = uVar115;
  auVar90._0_4_ = uVar115;
  auVar90._8_4_ = uVar115;
  auVar90._12_4_ = uVar115;
  auVar90._16_4_ = uVar115;
  auVar90._20_4_ = uVar115;
  auVar90._24_4_ = uVar115;
  auVar90._28_4_ = uVar115;
  auVar77 = vminps_avx512vl(auVar77,auVar90);
  auVar79 = vminps_avx(auVar79,auVar77);
  auVar91._8_4_ = 0x3f800003;
  auVar91._0_8_ = 0x3f8000033f800003;
  auVar91._12_4_ = 0x3f800003;
  auVar91._16_4_ = 0x3f800003;
  auVar91._20_4_ = 0x3f800003;
  auVar91._24_4_ = 0x3f800003;
  auVar91._28_4_ = 0x3f800003;
  auVar79 = vmulps_avx512vl(auVar79,auVar91);
  uVar16 = vpcmpgtd_avx512vl(auVar78,_DAT_01fe9900);
  uVar15 = vcmpps_avx512vl(local_1c0,auVar79,2);
  if ((byte)((byte)uVar15 & (byte)uVar16) != 0) {
    uVar41 = (ulong)(byte)((byte)uVar15 & (byte)uVar16);
    local_220 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar244 = ZEXT1664(auVar48);
    auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar245 = ZEXT1664(auVar48);
    auVar48 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar246 = ZEXT1664(auVar48);
    auVar253 = ZEXT464(0x3f800000);
    auVar48 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
    auVar252 = ZEXT1664(auVar48);
    do {
      lVar38 = 0;
      for (uVar36 = uVar41; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
        lVar38 = lVar38 + 1;
      }
      uVar43 = *(uint *)(prim + 2);
      uVar6 = *(uint *)(prim + lVar38 * 4 + 6);
      pGVar8 = (context->scene->geometries).items[uVar43].ptr;
      uVar36 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                               pGVar8[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * (ulong)uVar6);
      p_Var9 = pGVar8[1].intersectionFilterN;
      pvVar10 = pGVar8[2].userPtr;
      _Var11 = pGVar8[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar48 = *(undefined1 (*) [16])(_Var11 + uVar36 * (long)pvVar10);
      auVar58 = *(undefined1 (*) [16])(_Var11 + (uVar36 + 1) * (long)pvVar10);
      auVar3 = *(undefined1 (*) [16])(_Var11 + (uVar36 + 2) * (long)pvVar10);
      auVar57 = *(undefined1 (*) [16])(_Var11 + (long)pvVar10 * (uVar36 + 3));
      lVar38 = *(long *)&pGVar8[1].time_range.upper;
      auVar56 = *(undefined1 (*) [16])(lVar38 + (long)p_Var9 * uVar36);
      auVar55 = *(undefined1 (*) [16])(lVar38 + (long)p_Var9 * (uVar36 + 1));
      auVar59 = *(undefined1 (*) [16])(lVar38 + (long)p_Var9 * (uVar36 + 2));
      uVar41 = uVar41 - 1 & uVar41;
      auVar54 = *(undefined1 (*) [16])(lVar38 + (long)p_Var9 * (uVar36 + 3));
      if (uVar41 != 0) {
        uVar42 = uVar41 - 1 & uVar41;
        for (uVar36 = uVar41; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
        }
        if (uVar42 != 0) {
          for (; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
          }
        }
      }
      auVar4 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                             0x1c);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      fVar125 = *(float *)(ray + k * 4 + 0x60);
      auVar117 = ZEXT816(0) << 0x40;
      auVar52._0_4_ = auVar54._0_4_ * 0.0;
      auVar52._4_4_ = auVar54._4_4_ * 0.0;
      auVar52._8_4_ = auVar54._8_4_ * 0.0;
      auVar52._12_4_ = auVar54._12_4_ * 0.0;
      auVar233._8_4_ = 0x3e2aaaab;
      auVar233._0_8_ = 0x3e2aaaab3e2aaaab;
      auVar233._12_4_ = 0x3e2aaaab;
      auVar50 = vfmadd213ps_fma(auVar233,auVar59,auVar52);
      auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
      auVar50 = vfmadd231ps_avx512vl(auVar50,auVar55,auVar49);
      auVar116 = vfmadd231ps_fma(auVar50,auVar56,auVar233);
      auVar60 = auVar244._0_16_;
      auVar50 = vfmadd231ps_avx512vl(auVar52,auVar59,auVar60);
      auVar50 = vfnmadd231ps_fma(auVar50,auVar55,auVar117);
      auVar51 = vfnmadd231ps_avx512vl(auVar50,auVar56,auVar60);
      auVar212._0_4_ = auVar57._0_4_ * 0.0;
      auVar212._4_4_ = auVar57._4_4_ * 0.0;
      auVar212._8_4_ = auVar57._8_4_ * 0.0;
      auVar212._12_4_ = auVar57._12_4_ * 0.0;
      auVar50 = vfmadd213ps_fma(auVar233,auVar3,auVar212);
      auVar50 = vfmadd231ps_avx512vl(auVar50,auVar58,auVar49);
      auVar50 = vfmadd231ps_fma(auVar50,auVar48,auVar233);
      auVar52 = vfmadd231ps_avx512vl(auVar212,auVar3,auVar60);
      auVar52 = vfnmadd231ps_fma(auVar52,auVar58,auVar117);
      auVar53 = vfnmadd231ps_avx512vl(auVar52,auVar48,auVar60);
      auVar69._0_4_ = auVar54._0_4_ * 0.16666667;
      auVar69._4_4_ = auVar54._4_4_ * 0.16666667;
      auVar69._8_4_ = auVar54._8_4_ * 0.16666667;
      auVar69._12_4_ = auVar54._12_4_ * 0.16666667;
      auVar52 = vfmadd231ps_avx512vl(auVar69,auVar59,auVar49);
      auVar52 = vfmadd231ps_fma(auVar52,auVar55,auVar233);
      auVar52 = vfmadd231ps_fma(auVar52,auVar56,auVar117);
      auVar54 = vmulps_avx512vl(auVar54,auVar60);
      auVar59 = vfmadd231ps_fma(auVar54,auVar117,auVar59);
      auVar55 = vfnmadd231ps_avx512vl(auVar59,auVar60,auVar55);
      auVar59 = vfnmadd231ps_fma(auVar55,auVar117,auVar56);
      auVar181._0_4_ = auVar57._0_4_ * 0.16666667;
      auVar181._4_4_ = auVar57._4_4_ * 0.16666667;
      auVar181._8_4_ = auVar57._8_4_ * 0.16666667;
      auVar181._12_4_ = auVar57._12_4_ * 0.16666667;
      auVar56 = vfmadd231ps_avx512vl(auVar181,auVar3,auVar49);
      auVar56 = vfmadd231ps_fma(auVar56,auVar58,auVar233);
      auVar56 = vfmadd231ps_fma(auVar56,auVar48,auVar117);
      auVar57 = vmulps_avx512vl(auVar57,auVar60);
      auVar3 = vfmadd231ps_fma(auVar57,auVar117,auVar3);
      auVar58 = vfnmadd231ps_avx512vl(auVar3,auVar60,auVar58);
      auVar55 = vfnmadd231ps_fma(auVar58,auVar117,auVar48);
      auVar48 = vshufps_avx(auVar51,auVar51,0xc9);
      auVar58 = vshufps_avx(auVar50,auVar50,0xc9);
      fVar112 = auVar51._0_4_;
      auVar62._0_4_ = fVar112 * auVar58._0_4_;
      fVar113 = auVar51._4_4_;
      auVar62._4_4_ = fVar113 * auVar58._4_4_;
      fVar114 = auVar51._8_4_;
      auVar62._8_4_ = fVar114 * auVar58._8_4_;
      fVar124 = auVar51._12_4_;
      auVar62._12_4_ = fVar124 * auVar58._12_4_;
      auVar58 = vfmsub231ps_fma(auVar62,auVar48,auVar50);
      auVar3 = vshufps_avx(auVar58,auVar58,0xc9);
      auVar58 = vshufps_avx(auVar53,auVar53,0xc9);
      auVar63._0_4_ = fVar112 * auVar58._0_4_;
      auVar63._4_4_ = fVar113 * auVar58._4_4_;
      auVar63._8_4_ = fVar114 * auVar58._8_4_;
      auVar63._12_4_ = fVar124 * auVar58._12_4_;
      auVar48 = vfmsub231ps_fma(auVar63,auVar48,auVar53);
      auVar57 = vshufps_avx(auVar48,auVar48,0xc9);
      auVar48 = vshufps_avx(auVar59,auVar59,0xc9);
      auVar58 = vshufps_avx(auVar56,auVar56,0xc9);
      fVar133 = auVar59._0_4_;
      auVar67._0_4_ = fVar133 * auVar58._0_4_;
      fVar140 = auVar59._4_4_;
      auVar67._4_4_ = fVar140 * auVar58._4_4_;
      fVar141 = auVar59._8_4_;
      auVar67._8_4_ = fVar141 * auVar58._8_4_;
      fVar142 = auVar59._12_4_;
      auVar67._12_4_ = fVar142 * auVar58._12_4_;
      auVar58 = vfmsub231ps_fma(auVar67,auVar48,auVar56);
      auVar56 = vshufps_avx(auVar58,auVar58,0xc9);
      auVar58 = vshufps_avx(auVar55,auVar55,0xc9);
      auVar182._0_4_ = auVar58._0_4_ * fVar133;
      auVar182._4_4_ = auVar58._4_4_ * fVar140;
      auVar182._8_4_ = auVar58._8_4_ * fVar141;
      auVar182._12_4_ = auVar58._12_4_ * fVar142;
      auVar58 = vfmsub231ps_fma(auVar182,auVar48,auVar55);
      auVar48 = vdpps_avx(auVar3,auVar3,0x7f);
      auVar55 = vshufps_avx(auVar58,auVar58,0xc9);
      fVar200 = auVar48._0_4_;
      auVar183._4_12_ = ZEXT812(0) << 0x20;
      auVar183._0_4_ = fVar200;
      auVar58 = vrsqrt14ss_avx512f(auVar117,auVar183);
      auVar54 = vmulss_avx512f(auVar58,ZEXT416(0x3fc00000));
      auVar50 = vmulss_avx512f(auVar48,ZEXT416(0xbf000000));
      fVar107 = auVar58._0_4_;
      auVar58 = vdpps_avx(auVar3,auVar57,0x7f);
      fVar107 = auVar54._0_4_ + auVar50._0_4_ * fVar107 * fVar107 * fVar107;
      fVar211 = fVar107 * auVar3._0_4_;
      fVar222 = fVar107 * auVar3._4_4_;
      fVar223 = fVar107 * auVar3._8_4_;
      fVar224 = fVar107 * auVar3._12_4_;
      auVar193._0_4_ = auVar57._0_4_ * fVar200;
      auVar193._4_4_ = auVar57._4_4_ * fVar200;
      auVar193._8_4_ = auVar57._8_4_ * fVar200;
      auVar193._12_4_ = auVar57._12_4_ * fVar200;
      fVar200 = auVar58._0_4_;
      auVar161._0_4_ = fVar200 * auVar3._0_4_;
      auVar161._4_4_ = fVar200 * auVar3._4_4_;
      auVar161._8_4_ = fVar200 * auVar3._8_4_;
      auVar161._12_4_ = fVar200 * auVar3._12_4_;
      auVar3 = vsubps_avx(auVar193,auVar161);
      auVar58 = vrcp14ss_avx512f(auVar117,auVar183);
      auVar48 = vfnmadd213ss_avx512f(auVar48,auVar58,ZEXT416(0x40000000));
      fVar209 = auVar58._0_4_ * auVar48._0_4_;
      auVar48 = vdpps_avx(auVar56,auVar56,0x7f);
      fVar210 = auVar48._0_4_;
      auVar184._4_12_ = ZEXT812(0) << 0x20;
      auVar184._0_4_ = fVar210;
      auVar58 = vrsqrt14ss_avx512f(auVar117,auVar184);
      auVar57 = vmulss_avx512f(auVar58,ZEXT416(0x3fc00000));
      auVar54 = vmulss_avx512f(auVar48,ZEXT416(0xbf000000));
      fVar200 = auVar58._0_4_;
      fVar200 = auVar57._0_4_ + auVar54._0_4_ * fVar200 * fVar200 * fVar200;
      auVar58 = vdpps_avx(auVar56,auVar55,0x7f);
      fVar225 = fVar200 * auVar56._0_4_;
      fVar230 = fVar200 * auVar56._4_4_;
      fVar231 = fVar200 * auVar56._8_4_;
      fVar232 = fVar200 * auVar56._12_4_;
      auVar70._0_4_ = fVar210 * auVar55._0_4_;
      auVar70._4_4_ = fVar210 * auVar55._4_4_;
      auVar70._8_4_ = fVar210 * auVar55._8_4_;
      auVar70._12_4_ = fVar210 * auVar55._12_4_;
      fVar210 = auVar58._0_4_;
      auVar143._0_4_ = fVar210 * auVar56._0_4_;
      auVar143._4_4_ = fVar210 * auVar56._4_4_;
      auVar143._8_4_ = fVar210 * auVar56._8_4_;
      auVar143._12_4_ = fVar210 * auVar56._12_4_;
      auVar57 = vsubps_avx(auVar70,auVar143);
      auVar58 = vrcp14ss_avx512f(auVar117,auVar184);
      auVar48 = vfnmadd213ss_avx512f(auVar48,auVar58,ZEXT416(0x40000000));
      fVar210 = auVar48._0_4_ * auVar58._0_4_;
      auVar48 = vshufps_avx(auVar116,auVar116,0xff);
      auVar168._0_4_ = fVar211 * auVar48._0_4_;
      auVar168._4_4_ = fVar222 * auVar48._4_4_;
      auVar168._8_4_ = fVar223 * auVar48._8_4_;
      auVar168._12_4_ = fVar224 * auVar48._12_4_;
      local_340 = vsubps_avx(auVar116,auVar168);
      auVar58 = vshufps_avx(auVar51,auVar51,0xff);
      auVar72._0_4_ = auVar58._0_4_ * fVar211 + auVar48._0_4_ * fVar107 * fVar209 * auVar3._0_4_;
      auVar72._4_4_ = auVar58._4_4_ * fVar222 + auVar48._4_4_ * fVar107 * fVar209 * auVar3._4_4_;
      auVar72._8_4_ = auVar58._8_4_ * fVar223 + auVar48._8_4_ * fVar107 * fVar209 * auVar3._8_4_;
      auVar72._12_4_ = auVar58._12_4_ * fVar224 + auVar48._12_4_ * fVar107 * fVar209 * auVar3._12_4_
      ;
      auVar3 = vsubps_avx(auVar51,auVar72);
      local_350._0_4_ = auVar168._0_4_ + auVar116._0_4_;
      local_350._4_4_ = auVar168._4_4_ + auVar116._4_4_;
      fStack_348 = auVar168._8_4_ + auVar116._8_4_;
      fStack_344 = auVar168._12_4_ + auVar116._12_4_;
      auVar48 = vshufps_avx(auVar52,auVar52,0xff);
      auVar73._0_4_ = fVar225 * auVar48._0_4_;
      auVar73._4_4_ = fVar230 * auVar48._4_4_;
      auVar73._8_4_ = fVar231 * auVar48._8_4_;
      auVar73._12_4_ = fVar232 * auVar48._12_4_;
      local_360 = vsubps_avx512vl(auVar52,auVar73);
      auVar58 = vshufps_avx(auVar59,auVar59,0xff);
      auVar60._0_4_ = auVar58._0_4_ * fVar225 + auVar48._0_4_ * fVar200 * auVar57._0_4_ * fVar210;
      auVar60._4_4_ = auVar58._4_4_ * fVar230 + auVar48._4_4_ * fVar200 * auVar57._4_4_ * fVar210;
      auVar60._8_4_ = auVar58._8_4_ * fVar231 + auVar48._8_4_ * fVar200 * auVar57._8_4_ * fVar210;
      auVar60._12_4_ =
           auVar58._12_4_ * fVar232 + auVar48._12_4_ * fVar200 * auVar57._12_4_ * fVar210;
      auVar48 = vsubps_avx(auVar59,auVar60);
      local_370._0_4_ = auVar52._0_4_ + auVar73._0_4_;
      local_370._4_4_ = auVar52._4_4_ + auVar73._4_4_;
      fStack_368 = auVar52._8_4_ + auVar73._8_4_;
      fStack_364 = auVar52._12_4_ + auVar73._12_4_;
      auVar64._0_4_ = auVar3._0_4_ * 0.33333334;
      auVar64._4_4_ = auVar3._4_4_ * 0.33333334;
      auVar64._8_4_ = auVar3._8_4_ * 0.33333334;
      auVar64._12_4_ = auVar3._12_4_ * 0.33333334;
      local_380 = vaddps_avx512vl(local_340,auVar64);
      auVar65._0_4_ = auVar48._0_4_ * 0.33333334;
      auVar65._4_4_ = auVar48._4_4_ * 0.33333334;
      auVar65._8_4_ = auVar48._8_4_ * 0.33333334;
      auVar65._12_4_ = auVar48._12_4_ * 0.33333334;
      local_390 = vsubps_avx512vl(local_360,auVar65);
      auVar116._0_4_ = (fVar112 + auVar72._0_4_) * 0.33333334;
      auVar116._4_4_ = (fVar113 + auVar72._4_4_) * 0.33333334;
      auVar116._8_4_ = (fVar114 + auVar72._8_4_) * 0.33333334;
      auVar116._12_4_ = (fVar124 + auVar72._12_4_) * 0.33333334;
      _local_3a0 = vaddps_avx512vl(_local_350,auVar116);
      auVar49._0_4_ = (fVar133 + auVar60._0_4_) * 0.33333334;
      auVar49._4_4_ = (fVar140 + auVar60._4_4_) * 0.33333334;
      auVar49._8_4_ = (fVar141 + auVar60._8_4_) * 0.33333334;
      auVar49._12_4_ = (fVar142 + auVar60._12_4_) * 0.33333334;
      _local_3b0 = vsubps_avx512vl(_local_370,auVar49);
      local_2c0 = vsubps_avx(local_340,auVar4);
      uVar115 = local_2c0._0_4_;
      auVar61._4_4_ = uVar115;
      auVar61._0_4_ = uVar115;
      auVar61._8_4_ = uVar115;
      auVar61._12_4_ = uVar115;
      auVar48 = vshufps_avx(local_2c0,local_2c0,0x55);
      aVar1 = pre->ray_space[k].vx.field_0;
      aVar2 = pre->ray_space[k].vy.field_0;
      auVar58 = vshufps_avx(local_2c0,local_2c0,0xaa);
      fVar107 = pre->ray_space[k].vz.field_0.m128[0];
      fVar200 = pre->ray_space[k].vz.field_0.m128[1];
      fVar209 = pre->ray_space[k].vz.field_0.m128[2];
      fVar210 = pre->ray_space[k].vz.field_0.m128[3];
      auVar53._0_4_ = fVar107 * auVar58._0_4_;
      auVar53._4_4_ = fVar200 * auVar58._4_4_;
      auVar53._8_4_ = fVar209 * auVar58._8_4_;
      auVar53._12_4_ = fVar210 * auVar58._12_4_;
      auVar48 = vfmadd231ps_fma(auVar53,(undefined1  [16])aVar2,auVar48);
      auVar56 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar1,auVar61);
      local_2d0 = vsubps_avx512vl(local_380,auVar4);
      uVar115 = local_2d0._0_4_;
      auVar68._4_4_ = uVar115;
      auVar68._0_4_ = uVar115;
      auVar68._8_4_ = uVar115;
      auVar68._12_4_ = uVar115;
      auVar48 = vshufps_avx(local_2d0,local_2d0,0x55);
      auVar58 = vshufps_avx(local_2d0,local_2d0,0xaa);
      auVar71._0_4_ = fVar107 * auVar58._0_4_;
      auVar71._4_4_ = fVar200 * auVar58._4_4_;
      auVar71._8_4_ = fVar209 * auVar58._8_4_;
      auVar71._12_4_ = fVar210 * auVar58._12_4_;
      auVar48 = vfmadd231ps_fma(auVar71,(undefined1  [16])aVar2,auVar48);
      auVar55 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar1,auVar68);
      local_2e0 = vsubps_avx512vl(local_390,auVar4);
      uVar115 = local_2e0._0_4_;
      auVar153._4_4_ = uVar115;
      auVar153._0_4_ = uVar115;
      auVar153._8_4_ = uVar115;
      auVar153._12_4_ = uVar115;
      auVar48 = vshufps_avx(local_2e0,local_2e0,0x55);
      auVar58 = vshufps_avx(local_2e0,local_2e0,0xaa);
      auVar66._0_4_ = fVar107 * auVar58._0_4_;
      auVar66._4_4_ = fVar200 * auVar58._4_4_;
      auVar66._8_4_ = fVar209 * auVar58._8_4_;
      auVar66._12_4_ = fVar210 * auVar58._12_4_;
      auVar48 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar2,auVar48);
      auVar59 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar1,auVar153);
      local_2f0 = vsubps_avx512vl(local_360,auVar4);
      uVar115 = local_2f0._0_4_;
      auVar169._4_4_ = uVar115;
      auVar169._0_4_ = uVar115;
      auVar169._8_4_ = uVar115;
      auVar169._12_4_ = uVar115;
      auVar48 = vshufps_avx(local_2f0,local_2f0,0x55);
      auVar58 = vshufps_avx(local_2f0,local_2f0,0xaa);
      auVar154._0_4_ = fVar107 * auVar58._0_4_;
      auVar154._4_4_ = fVar200 * auVar58._4_4_;
      auVar154._8_4_ = fVar209 * auVar58._8_4_;
      auVar154._12_4_ = fVar210 * auVar58._12_4_;
      auVar48 = vfmadd231ps_fma(auVar154,(undefined1  [16])aVar2,auVar48);
      auVar54 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar1,auVar169);
      local_300 = vsubps_avx(_local_350,auVar4);
      uVar115 = local_300._0_4_;
      auVar170._4_4_ = uVar115;
      auVar170._0_4_ = uVar115;
      auVar170._8_4_ = uVar115;
      auVar170._12_4_ = uVar115;
      auVar48 = vshufps_avx(local_300,local_300,0x55);
      auVar58 = vshufps_avx(local_300,local_300,0xaa);
      auVar194._0_4_ = auVar58._0_4_ * fVar107;
      auVar194._4_4_ = auVar58._4_4_ * fVar200;
      auVar194._8_4_ = auVar58._8_4_ * fVar209;
      auVar194._12_4_ = auVar58._12_4_ * fVar210;
      auVar48 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar2,auVar48);
      auVar116 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar1,auVar170);
      local_310 = vsubps_avx512vl(_local_3a0,auVar4);
      uVar115 = local_310._0_4_;
      auVar171._4_4_ = uVar115;
      auVar171._0_4_ = uVar115;
      auVar171._8_4_ = uVar115;
      auVar171._12_4_ = uVar115;
      auVar48 = vshufps_avx(local_310,local_310,0x55);
      auVar58 = vshufps_avx(local_310,local_310,0xaa);
      auVar201._0_4_ = auVar58._0_4_ * fVar107;
      auVar201._4_4_ = auVar58._4_4_ * fVar200;
      auVar201._8_4_ = auVar58._8_4_ * fVar209;
      auVar201._12_4_ = auVar58._12_4_ * fVar210;
      auVar48 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar2,auVar48);
      auVar52 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar1,auVar171);
      local_320 = vsubps_avx512vl(_local_3b0,auVar4);
      uVar115 = local_320._0_4_;
      auVar172._4_4_ = uVar115;
      auVar172._0_4_ = uVar115;
      auVar172._8_4_ = uVar115;
      auVar172._12_4_ = uVar115;
      auVar48 = vshufps_avx(local_320,local_320,0x55);
      auVar58 = vshufps_avx(local_320,local_320,0xaa);
      auVar213._0_4_ = auVar58._0_4_ * fVar107;
      auVar213._4_4_ = auVar58._4_4_ * fVar200;
      auVar213._8_4_ = auVar58._8_4_ * fVar209;
      auVar213._12_4_ = auVar58._12_4_ * fVar210;
      auVar48 = vfmadd231ps_fma(auVar213,(undefined1  [16])aVar2,auVar48);
      auVar49 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar1,auVar172);
      local_330 = vsubps_avx(_local_370,auVar4);
      uVar115 = local_330._0_4_;
      auVar51._4_4_ = uVar115;
      auVar51._0_4_ = uVar115;
      auVar51._8_4_ = uVar115;
      auVar51._12_4_ = uVar115;
      auVar48 = vshufps_avx(local_330,local_330,0x55);
      auVar58 = vshufps_avx(local_330,local_330,0xaa);
      auVar162._0_4_ = auVar58._0_4_ * fVar107;
      auVar162._4_4_ = auVar58._4_4_ * fVar200;
      auVar162._8_4_ = auVar58._8_4_ * fVar209;
      auVar162._12_4_ = auVar58._12_4_ * fVar210;
      auVar48 = vfmadd231ps_fma(auVar162,(undefined1  [16])aVar2,auVar48);
      auVar4 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar1,auVar51);
      auVar3 = vmovlhps_avx(auVar56,auVar116);
      local_440 = vmovlhps_avx(auVar55,auVar52);
      local_450 = vmovlhps_avx512f(auVar59,auVar49);
      _local_290 = vmovlhps_avx512f(auVar54,auVar4);
      auVar58 = vminps_avx(auVar3,local_440);
      auVar48 = vmaxps_avx(auVar3,local_440);
      auVar57 = vminps_avx512vl(local_450,_local_290);
      auVar58 = vminps_avx(auVar58,auVar57);
      auVar57 = vmaxps_avx512vl(local_450,_local_290);
      auVar48 = vmaxps_avx(auVar48,auVar57);
      auVar57 = vshufpd_avx(auVar58,auVar58,3);
      auVar58 = vminps_avx(auVar58,auVar57);
      auVar57 = vshufpd_avx(auVar48,auVar48,3);
      auVar48 = vmaxps_avx(auVar48,auVar57);
      auVar58 = vandps_avx512vl(auVar58,auVar245._0_16_);
      auVar48 = vandps_avx512vl(auVar48,auVar245._0_16_);
      auVar48 = vmaxps_avx(auVar58,auVar48);
      auVar58 = vmovshdup_avx(auVar48);
      auVar48 = vmaxss_avx(auVar58,auVar48);
      auVar57 = vmovddup_avx512vl(auVar56);
      auVar56 = vmovddup_avx512vl(auVar55);
      auVar55 = vmovddup_avx512vl(auVar59);
      auVar117._8_8_ = auVar54._0_8_;
      auVar117._0_8_ = auVar54._0_8_;
      local_2a0 = ZEXT416((uint)(auVar48._0_4_ * 9.536743e-07));
      local_260 = vbroadcastss_avx512vl(local_2a0);
      auVar48 = vxorps_avx512vl(local_260._0_16_,auVar246._0_16_);
      local_280 = vbroadcastss_avx512vl(auVar48);
      uVar36 = 0;
      auVar48 = vsubps_avx(local_440,auVar3);
      auVar59 = vsubps_avx512vl(local_450,local_440);
      local_2b0 = vsubps_avx512vl(_local_290,local_450);
      local_3c0 = vsubps_avx(_local_350,local_340);
      local_3d0 = vsubps_avx512vl(_local_3a0,local_380);
      local_3e0 = vsubps_avx512vl(_local_3b0,local_390);
      _local_3f0 = vsubps_avx512vl(_local_370,local_360);
      local_1e0 = vpbroadcastd_avx512vl();
      local_200 = vpbroadcastd_avx512vl();
      auVar58 = ZEXT816(0x3f80000000000000);
      auVar50 = auVar58;
LAB_01cccbd0:
      auVar54 = vshufps_avx(auVar50,auVar50,0x50);
      auVar234._8_4_ = 0x3f800000;
      auVar234._0_8_ = 0x3f8000003f800000;
      auVar234._12_4_ = 0x3f800000;
      auVar237._16_4_ = 0x3f800000;
      auVar237._0_16_ = auVar234;
      auVar237._20_4_ = 0x3f800000;
      auVar237._24_4_ = 0x3f800000;
      auVar237._28_4_ = 0x3f800000;
      auVar51 = vsubps_avx(auVar234,auVar54);
      fVar107 = auVar54._0_4_;
      fVar112 = auVar116._0_4_;
      auVar134._0_4_ = fVar112 * fVar107;
      fVar200 = auVar54._4_4_;
      fVar113 = auVar116._4_4_;
      auVar134._4_4_ = fVar113 * fVar200;
      fVar209 = auVar54._8_4_;
      auVar134._8_4_ = fVar112 * fVar209;
      fVar210 = auVar54._12_4_;
      auVar134._12_4_ = fVar113 * fVar210;
      fVar114 = auVar52._0_4_;
      auVar144._0_4_ = fVar114 * fVar107;
      fVar124 = auVar52._4_4_;
      auVar144._4_4_ = fVar124 * fVar200;
      auVar144._8_4_ = fVar114 * fVar209;
      auVar144._12_4_ = fVar124 * fVar210;
      fVar133 = auVar49._0_4_;
      auVar155._0_4_ = fVar133 * fVar107;
      fVar140 = auVar49._4_4_;
      auVar155._4_4_ = fVar140 * fVar200;
      auVar155._8_4_ = fVar133 * fVar209;
      auVar155._12_4_ = fVar140 * fVar210;
      fVar141 = auVar4._0_4_;
      auVar119._0_4_ = fVar141 * fVar107;
      fVar142 = auVar4._4_4_;
      auVar119._4_4_ = fVar142 * fVar200;
      auVar119._8_4_ = fVar141 * fVar209;
      auVar119._12_4_ = fVar142 * fVar210;
      auVar53 = vfmadd231ps_avx512vl(auVar134,auVar51,auVar57);
      auVar60 = vfmadd231ps_avx512vl(auVar144,auVar51,auVar56);
      auVar61 = vfmadd231ps_avx512vl(auVar155,auVar51,auVar55);
      auVar51 = vfmadd231ps_fma(auVar119,auVar117,auVar51);
      auVar54 = vmovshdup_avx(auVar58);
      fVar200 = auVar58._0_4_;
      fVar107 = (auVar54._0_4_ - fVar200) * 0.04761905;
      auVar180._4_4_ = fVar200;
      auVar180._0_4_ = fVar200;
      auVar180._8_4_ = fVar200;
      auVar180._12_4_ = fVar200;
      auVar180._16_4_ = fVar200;
      auVar180._20_4_ = fVar200;
      auVar180._24_4_ = fVar200;
      auVar180._28_4_ = fVar200;
      auVar131._0_8_ = auVar54._0_8_;
      auVar131._8_8_ = auVar131._0_8_;
      auVar131._16_8_ = auVar131._0_8_;
      auVar131._24_8_ = auVar131._0_8_;
      auVar79 = vsubps_avx(auVar131,auVar180);
      uVar115 = auVar53._0_4_;
      auVar132._4_4_ = uVar115;
      auVar132._0_4_ = uVar115;
      auVar132._8_4_ = uVar115;
      auVar132._12_4_ = uVar115;
      auVar132._16_4_ = uVar115;
      auVar132._20_4_ = uVar115;
      auVar132._24_4_ = uVar115;
      auVar132._28_4_ = uVar115;
      auVar197._8_4_ = 1;
      auVar197._0_8_ = 0x100000001;
      auVar197._12_4_ = 1;
      auVar197._16_4_ = 1;
      auVar197._20_4_ = 1;
      auVar197._24_4_ = 1;
      auVar197._28_4_ = 1;
      auVar90 = ZEXT1632(auVar53);
      auVar77 = vpermps_avx2(auVar197,auVar90);
      auVar80 = vbroadcastss_avx512vl(auVar60);
      auVar91 = ZEXT1632(auVar60);
      auVar78 = vpermps_avx512vl(auVar197,auVar91);
      auVar81 = vbroadcastss_avx512vl(auVar61);
      auVar75 = ZEXT1632(auVar61);
      auVar82 = vpermps_avx512vl(auVar197,auVar75);
      auVar83 = vbroadcastss_avx512vl(auVar51);
      auVar87 = ZEXT1632(auVar51);
      auVar84 = vpermps_avx512vl(auVar197,auVar87);
      auVar198._4_4_ = fVar107;
      auVar198._0_4_ = fVar107;
      auVar198._8_4_ = fVar107;
      auVar198._12_4_ = fVar107;
      auVar198._16_4_ = fVar107;
      auVar198._20_4_ = fVar107;
      auVar198._24_4_ = fVar107;
      auVar198._28_4_ = fVar107;
      auVar88 = auVar251._0_32_;
      auVar76 = vpermps_avx512vl(auVar88,auVar90);
      auVar167._8_4_ = 3;
      auVar167._0_8_ = 0x300000003;
      auVar167._12_4_ = 3;
      auVar167._16_4_ = 3;
      auVar167._20_4_ = 3;
      auVar167._24_4_ = 3;
      auVar167._28_4_ = 3;
      auVar85 = vpermps_avx512vl(auVar167,auVar90);
      auVar86 = vpermps_avx512vl(auVar88,auVar91);
      auVar90 = vpermps_avx2(auVar167,auVar91);
      auVar74 = vpermps_avx512vl(auVar88,auVar75);
      auVar91 = vpermps_avx2(auVar167,auVar75);
      auVar75 = vpermps_avx512vl(auVar88,auVar87);
      auVar87 = vpermps_avx512vl(auVar167,auVar87);
      auVar54 = vfmadd132ps_fma(auVar79,auVar180,_DAT_01faff20);
      auVar79 = vsubps_avx(auVar237,ZEXT1632(auVar54));
      auVar88 = vmulps_avx512vl(auVar80,ZEXT1632(auVar54));
      auVar92 = ZEXT1632(auVar54);
      auVar89 = vmulps_avx512vl(auVar78,auVar92);
      auVar51 = vfmadd231ps_fma(auVar88,auVar79,auVar132);
      auVar53 = vfmadd231ps_fma(auVar89,auVar79,auVar77);
      auVar88 = vmulps_avx512vl(auVar81,auVar92);
      auVar89 = vmulps_avx512vl(auVar82,auVar92);
      auVar80 = vfmadd231ps_avx512vl(auVar88,auVar79,auVar80);
      auVar78 = vfmadd231ps_avx512vl(auVar89,auVar79,auVar78);
      auVar88 = vmulps_avx512vl(auVar83,auVar92);
      auVar89 = ZEXT1632(auVar54);
      auVar84 = vmulps_avx512vl(auVar84,auVar89);
      auVar81 = vfmadd231ps_avx512vl(auVar88,auVar79,auVar81);
      auVar82 = vfmadd231ps_avx512vl(auVar84,auVar79,auVar82);
      fVar209 = auVar54._0_4_;
      fVar210 = auVar54._4_4_;
      auVar21._4_4_ = fVar210 * auVar80._4_4_;
      auVar21._0_4_ = fVar209 * auVar80._0_4_;
      fVar211 = auVar54._8_4_;
      auVar21._8_4_ = fVar211 * auVar80._8_4_;
      fVar222 = auVar54._12_4_;
      auVar21._12_4_ = fVar222 * auVar80._12_4_;
      auVar21._16_4_ = auVar80._16_4_ * 0.0;
      auVar21._20_4_ = auVar80._20_4_ * 0.0;
      auVar21._24_4_ = auVar80._24_4_ * 0.0;
      auVar21._28_4_ = fVar200;
      auVar22._4_4_ = fVar210 * auVar78._4_4_;
      auVar22._0_4_ = fVar209 * auVar78._0_4_;
      auVar22._8_4_ = fVar211 * auVar78._8_4_;
      auVar22._12_4_ = fVar222 * auVar78._12_4_;
      auVar22._16_4_ = auVar78._16_4_ * 0.0;
      auVar22._20_4_ = auVar78._20_4_ * 0.0;
      auVar22._24_4_ = auVar78._24_4_ * 0.0;
      auVar22._28_4_ = auVar77._28_4_;
      auVar51 = vfmadd231ps_fma(auVar21,auVar79,ZEXT1632(auVar51));
      auVar53 = vfmadd231ps_fma(auVar22,auVar79,ZEXT1632(auVar53));
      auVar122._0_4_ = fVar209 * auVar81._0_4_;
      auVar122._4_4_ = fVar210 * auVar81._4_4_;
      auVar122._8_4_ = fVar211 * auVar81._8_4_;
      auVar122._12_4_ = fVar222 * auVar81._12_4_;
      auVar122._16_4_ = auVar81._16_4_ * 0.0;
      auVar122._20_4_ = auVar81._20_4_ * 0.0;
      auVar122._24_4_ = auVar81._24_4_ * 0.0;
      auVar122._28_4_ = 0;
      auVar23._4_4_ = fVar210 * auVar82._4_4_;
      auVar23._0_4_ = fVar209 * auVar82._0_4_;
      auVar23._8_4_ = fVar211 * auVar82._8_4_;
      auVar23._12_4_ = fVar222 * auVar82._12_4_;
      auVar23._16_4_ = auVar82._16_4_ * 0.0;
      auVar23._20_4_ = auVar82._20_4_ * 0.0;
      auVar23._24_4_ = auVar82._24_4_ * 0.0;
      auVar23._28_4_ = auVar81._28_4_;
      auVar60 = vfmadd231ps_fma(auVar122,auVar79,auVar80);
      auVar61 = vfmadd231ps_fma(auVar23,auVar79,auVar78);
      auVar24._28_4_ = auVar78._28_4_;
      auVar24._0_28_ =
           ZEXT1628(CONCAT412(fVar222 * auVar61._12_4_,
                              CONCAT48(fVar211 * auVar61._8_4_,
                                       CONCAT44(fVar210 * auVar61._4_4_,fVar209 * auVar61._0_4_))));
      auVar71 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar222 * auVar60._12_4_,
                                                   CONCAT48(fVar211 * auVar60._8_4_,
                                                            CONCAT44(fVar210 * auVar60._4_4_,
                                                                     fVar209 * auVar60._0_4_)))),
                                auVar79,ZEXT1632(auVar51));
      auVar69 = vfmadd231ps_fma(auVar24,auVar79,ZEXT1632(auVar53));
      auVar77 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar51));
      auVar80 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar53));
      auVar78 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar77 = vmulps_avx512vl(auVar77,auVar78);
      auVar80 = vmulps_avx512vl(auVar80,auVar78);
      auVar192._0_4_ = fVar107 * auVar77._0_4_;
      auVar192._4_4_ = fVar107 * auVar77._4_4_;
      auVar192._8_4_ = fVar107 * auVar77._8_4_;
      auVar192._12_4_ = fVar107 * auVar77._12_4_;
      auVar192._16_4_ = fVar107 * auVar77._16_4_;
      auVar192._20_4_ = fVar107 * auVar77._20_4_;
      auVar192._24_4_ = fVar107 * auVar77._24_4_;
      auVar192._28_4_ = 0;
      auVar77 = vmulps_avx512vl(auVar198,auVar80);
      auVar53 = vxorps_avx512vl(auVar83._0_16_,auVar83._0_16_);
      auVar80 = vpermt2ps_avx512vl(ZEXT1632(auVar71),_DAT_01feed00,ZEXT1632(auVar53));
      auVar81 = vpermt2ps_avx512vl(ZEXT1632(auVar69),_DAT_01feed00,ZEXT1632(auVar53));
      auVar123._0_4_ = auVar192._0_4_ + auVar71._0_4_;
      auVar123._4_4_ = auVar192._4_4_ + auVar71._4_4_;
      auVar123._8_4_ = auVar192._8_4_ + auVar71._8_4_;
      auVar123._12_4_ = auVar192._12_4_ + auVar71._12_4_;
      auVar123._16_4_ = auVar192._16_4_ + 0.0;
      auVar123._20_4_ = auVar192._20_4_ + 0.0;
      auVar123._24_4_ = auVar192._24_4_ + 0.0;
      auVar123._28_4_ = 0;
      auVar92 = ZEXT1632(auVar53);
      auVar82 = vpermt2ps_avx512vl(auVar192,_DAT_01feed00,auVar92);
      auVar83 = vaddps_avx512vl(ZEXT1632(auVar69),auVar77);
      auVar84 = vpermt2ps_avx512vl(auVar77,_DAT_01feed00,auVar92);
      auVar77 = vsubps_avx(auVar80,auVar82);
      auVar82 = vsubps_avx512vl(auVar81,auVar84);
      auVar84 = vmulps_avx512vl(auVar86,auVar89);
      auVar88 = vmulps_avx512vl(auVar90,auVar89);
      auVar84 = vfmadd231ps_avx512vl(auVar84,auVar79,auVar76);
      auVar76 = vfmadd231ps_avx512vl(auVar88,auVar79,auVar85);
      auVar85 = vmulps_avx512vl(auVar74,auVar89);
      auVar88 = vmulps_avx512vl(auVar91,auVar89);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar79,auVar86);
      auVar90 = vfmadd231ps_avx512vl(auVar88,auVar79,auVar90);
      auVar86 = vmulps_avx512vl(auVar75,auVar89);
      auVar75 = vmulps_avx512vl(auVar87,auVar89);
      auVar51 = vfmadd231ps_fma(auVar86,auVar79,auVar74);
      auVar86 = vfmadd231ps_avx512vl(auVar75,auVar79,auVar91);
      auVar74 = vmulps_avx512vl(auVar89,auVar85);
      auVar87 = ZEXT1632(auVar54);
      auVar75 = vmulps_avx512vl(auVar87,auVar90);
      auVar84 = vfmadd231ps_avx512vl(auVar74,auVar79,auVar84);
      auVar76 = vfmadd231ps_avx512vl(auVar75,auVar79,auVar76);
      auVar86 = vmulps_avx512vl(auVar87,auVar86);
      auVar85 = vfmadd231ps_avx512vl
                          (ZEXT1632(CONCAT412(fVar222 * auVar51._12_4_,
                                              CONCAT48(fVar211 * auVar51._8_4_,
                                                       CONCAT44(fVar210 * auVar51._4_4_,
                                                                fVar209 * auVar51._0_4_)))),auVar79,
                           auVar85);
      auVar90 = vfmadd231ps_avx512vl(auVar86,auVar79,auVar90);
      auVar25._4_4_ = fVar210 * auVar85._4_4_;
      auVar25._0_4_ = fVar209 * auVar85._0_4_;
      auVar25._8_4_ = fVar211 * auVar85._8_4_;
      auVar25._12_4_ = fVar222 * auVar85._12_4_;
      auVar25._16_4_ = auVar85._16_4_ * 0.0;
      auVar25._20_4_ = auVar85._20_4_ * 0.0;
      auVar25._24_4_ = auVar85._24_4_ * 0.0;
      auVar25._28_4_ = auVar91._28_4_;
      auVar91 = vmulps_avx512vl(auVar87,auVar90);
      auVar86 = vfmadd231ps_avx512vl(auVar25,auVar79,auVar84);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar76,auVar79);
      auVar79 = vsubps_avx512vl(auVar85,auVar84);
      auVar90 = vsubps_avx512vl(auVar90,auVar76);
      auVar79 = vmulps_avx512vl(auVar79,auVar78);
      auVar90 = vmulps_avx512vl(auVar90,auVar78);
      fVar200 = fVar107 * auVar79._0_4_;
      fVar209 = fVar107 * auVar79._4_4_;
      auVar26._4_4_ = fVar209;
      auVar26._0_4_ = fVar200;
      fVar210 = fVar107 * auVar79._8_4_;
      auVar26._8_4_ = fVar210;
      fVar211 = fVar107 * auVar79._12_4_;
      auVar26._12_4_ = fVar211;
      fVar222 = fVar107 * auVar79._16_4_;
      auVar26._16_4_ = fVar222;
      fVar223 = fVar107 * auVar79._20_4_;
      auVar26._20_4_ = fVar223;
      fVar107 = fVar107 * auVar79._24_4_;
      auVar26._24_4_ = fVar107;
      auVar26._28_4_ = auVar79._28_4_;
      auVar90 = vmulps_avx512vl(auVar198,auVar90);
      auVar78 = vpermt2ps_avx512vl(auVar86,_DAT_01feed00,auVar92);
      auVar84 = vpermt2ps_avx512vl(auVar91,_DAT_01feed00,auVar92);
      auVar199._0_4_ = auVar86._0_4_ + fVar200;
      auVar199._4_4_ = auVar86._4_4_ + fVar209;
      auVar199._8_4_ = auVar86._8_4_ + fVar210;
      auVar199._12_4_ = auVar86._12_4_ + fVar211;
      auVar199._16_4_ = auVar86._16_4_ + fVar222;
      auVar199._20_4_ = auVar86._20_4_ + fVar223;
      auVar199._24_4_ = auVar86._24_4_ + fVar107;
      auVar199._28_4_ = auVar86._28_4_ + auVar79._28_4_;
      auVar79 = vpermt2ps_avx512vl(auVar26,_DAT_01feed00,ZEXT1632(auVar53));
      auVar76 = vaddps_avx512vl(auVar91,auVar90);
      auVar90 = vpermt2ps_avx512vl(auVar90,_DAT_01feed00,ZEXT1632(auVar53));
      auVar79 = vsubps_avx(auVar78,auVar79);
      auVar90 = vsubps_avx512vl(auVar84,auVar90);
      auVar137 = ZEXT1632(auVar71);
      auVar85 = vsubps_avx512vl(auVar86,auVar137);
      auVar150 = ZEXT1632(auVar69);
      auVar74 = vsubps_avx512vl(auVar91,auVar150);
      auVar75 = vsubps_avx512vl(auVar78,auVar80);
      auVar85 = vaddps_avx512vl(auVar85,auVar75);
      auVar75 = vsubps_avx512vl(auVar84,auVar81);
      auVar74 = vaddps_avx512vl(auVar74,auVar75);
      auVar75 = vmulps_avx512vl(auVar150,auVar85);
      auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar137,auVar74);
      auVar87 = vmulps_avx512vl(auVar83,auVar85);
      auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar123,auVar74);
      auVar88 = vmulps_avx512vl(auVar82,auVar85);
      auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar77,auVar74);
      auVar89 = vmulps_avx512vl(auVar81,auVar85);
      auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar80,auVar74);
      auVar92 = vmulps_avx512vl(auVar91,auVar85);
      auVar92 = vfnmadd231ps_avx512vl(auVar92,auVar86,auVar74);
      auVar93 = vmulps_avx512vl(auVar76,auVar85);
      auVar93 = vfnmadd231ps_avx512vl(auVar93,auVar199,auVar74);
      auVar94 = vmulps_avx512vl(auVar90,auVar85);
      auVar94 = vfnmadd231ps_avx512vl(auVar94,auVar79,auVar74);
      auVar85 = vmulps_avx512vl(auVar84,auVar85);
      auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar78,auVar74);
      auVar74 = vminps_avx512vl(auVar75,auVar87);
      auVar75 = vmaxps_avx512vl(auVar75,auVar87);
      auVar87 = vminps_avx512vl(auVar88,auVar89);
      auVar74 = vminps_avx512vl(auVar74,auVar87);
      auVar87 = vmaxps_avx512vl(auVar88,auVar89);
      auVar75 = vmaxps_avx512vl(auVar75,auVar87);
      auVar87 = vminps_avx512vl(auVar92,auVar93);
      auVar88 = vmaxps_avx512vl(auVar92,auVar93);
      auVar89 = vminps_avx512vl(auVar94,auVar85);
      auVar87 = vminps_avx512vl(auVar87,auVar89);
      auVar74 = vminps_avx512vl(auVar74,auVar87);
      auVar85 = vmaxps_avx512vl(auVar94,auVar85);
      auVar85 = vmaxps_avx512vl(auVar88,auVar85);
      auVar85 = vmaxps_avx512vl(auVar75,auVar85);
      uVar15 = vcmpps_avx512vl(auVar74,local_260,2);
      uVar16 = vcmpps_avx512vl(auVar85,local_280,5);
      bVar34 = (byte)uVar15 & (byte)uVar16 & 0x7f;
      if (bVar34 != 0) {
        auVar85 = vsubps_avx512vl(auVar80,auVar137);
        auVar74 = vsubps_avx512vl(auVar81,auVar150);
        auVar75 = vsubps_avx512vl(auVar78,auVar86);
        auVar85 = vaddps_avx512vl(auVar85,auVar75);
        auVar75 = vsubps_avx512vl(auVar84,auVar91);
        auVar74 = vaddps_avx512vl(auVar74,auVar75);
        auVar75 = vmulps_avx512vl(auVar150,auVar85);
        auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar74,auVar137);
        auVar83 = vmulps_avx512vl(auVar83,auVar85);
        auVar83 = vfnmadd213ps_avx512vl(auVar123,auVar74,auVar83);
        auVar82 = vmulps_avx512vl(auVar82,auVar85);
        auVar82 = vfnmadd213ps_avx512vl(auVar77,auVar74,auVar82);
        auVar77 = vmulps_avx512vl(auVar81,auVar85);
        auVar81 = vfnmadd231ps_avx512vl(auVar77,auVar74,auVar80);
        auVar77 = vmulps_avx512vl(auVar91,auVar85);
        auVar91 = vfnmadd231ps_avx512vl(auVar77,auVar74,auVar86);
        auVar77 = vmulps_avx512vl(auVar76,auVar85);
        auVar76 = vfnmadd213ps_avx512vl(auVar199,auVar74,auVar77);
        auVar77 = vmulps_avx512vl(auVar90,auVar85);
        auVar86 = vfnmadd213ps_avx512vl(auVar79,auVar74,auVar77);
        auVar79 = vmulps_avx512vl(auVar84,auVar85);
        auVar78 = vfnmadd231ps_avx512vl(auVar79,auVar78,auVar74);
        auVar77 = vminps_avx(auVar75,auVar83);
        auVar79 = vmaxps_avx(auVar75,auVar83);
        auVar80 = vminps_avx(auVar82,auVar81);
        auVar80 = vminps_avx(auVar77,auVar80);
        auVar77 = vmaxps_avx(auVar82,auVar81);
        auVar79 = vmaxps_avx(auVar79,auVar77);
        auVar90 = vminps_avx(auVar91,auVar76);
        auVar77 = vmaxps_avx(auVar91,auVar76);
        auVar91 = vminps_avx(auVar86,auVar78);
        auVar90 = vminps_avx(auVar90,auVar91);
        auVar90 = vminps_avx(auVar80,auVar90);
        auVar80 = vmaxps_avx(auVar86,auVar78);
        auVar77 = vmaxps_avx(auVar77,auVar80);
        auVar79 = vmaxps_avx(auVar79,auVar77);
        uVar15 = vcmpps_avx512vl(auVar79,local_280,5);
        uVar16 = vcmpps_avx512vl(auVar90,local_260,2);
        bVar34 = bVar34 & (byte)uVar15 & (byte)uVar16;
        if (bVar34 != 0) {
          auStack_430[uVar36] = (uint)bVar34;
          uVar15 = vmovlps_avx(auVar58);
          (&uStack_240)[uVar36] = uVar15;
          uVar42 = vmovlps_avx(auVar50);
          auStack_1a0[uVar36] = uVar42;
          uVar36 = (ulong)((int)uVar36 + 1);
        }
      }
      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar244 = ZEXT1664(auVar58);
      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar245 = ZEXT1664(auVar58);
      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar246 = ZEXT1664(auVar58);
      auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar247 = ZEXT3264(auVar79);
      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar248 = ZEXT1664(auVar58);
      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar249 = ZEXT1664(auVar58);
      auVar250 = ZEXT3264(_DAT_01feed20);
      if ((int)uVar36 != 0) {
        do {
          uVar35 = (int)uVar36 - 1;
          uVar37 = (ulong)uVar35;
          uVar7 = auStack_430[uVar37];
          auVar50._8_8_ = 0;
          auVar50._0_8_ = auStack_1a0[uVar37];
          uVar42 = 0;
          for (uVar40 = (ulong)uVar7; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000)
          {
            uVar42 = uVar42 + 1;
          }
          uVar39 = uVar7 - 1 & uVar7;
          bVar46 = uVar39 == 0;
          auStack_430[uVar37] = uVar39;
          if (bVar46) {
            uVar36 = (ulong)uVar35;
          }
          auVar108._8_8_ = 0;
          auVar108._0_8_ = uVar42;
          auVar58 = vpunpcklqdq_avx(auVar108,ZEXT416((int)uVar42 + 1));
          auVar58 = vcvtqq2ps_avx512vl(auVar58);
          auVar58 = vmulps_avx512vl(auVar58,auVar248._0_16_);
          uVar115 = *(undefined4 *)((long)&uStack_240 + uVar37 * 8 + 4);
          auVar17._4_4_ = uVar115;
          auVar17._0_4_ = uVar115;
          auVar17._8_4_ = uVar115;
          auVar17._12_4_ = uVar115;
          auVar54 = vmulps_avx512vl(auVar58,auVar17);
          auVar51 = auVar249._0_16_;
          auVar58 = vsubps_avx512vl(auVar51,auVar58);
          uVar115 = *(undefined4 *)(&uStack_240 + uVar37);
          auVar18._4_4_ = uVar115;
          auVar18._0_4_ = uVar115;
          auVar18._8_4_ = uVar115;
          auVar18._12_4_ = uVar115;
          auVar58 = vfmadd231ps_avx512vl(auVar54,auVar58,auVar18);
          auVar54 = vmovshdup_avx(auVar58);
          fVar107 = auVar54._0_4_ - auVar58._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar107));
          if (uVar7 == 0 || bVar46) goto LAB_01cccbd0;
          auVar54 = vshufps_avx(auVar50,auVar50,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar107));
          auVar61 = vsubps_avx512vl(auVar51,auVar54);
          fVar200 = auVar54._0_4_;
          auVar145._0_4_ = fVar200 * fVar112;
          fVar209 = auVar54._4_4_;
          auVar145._4_4_ = fVar209 * fVar113;
          fVar210 = auVar54._8_4_;
          auVar145._8_4_ = fVar210 * fVar112;
          fVar211 = auVar54._12_4_;
          auVar145._12_4_ = fVar211 * fVar113;
          auVar156._0_4_ = fVar200 * fVar114;
          auVar156._4_4_ = fVar209 * fVar124;
          auVar156._8_4_ = fVar210 * fVar114;
          auVar156._12_4_ = fVar211 * fVar124;
          auVar163._0_4_ = fVar200 * fVar133;
          auVar163._4_4_ = fVar209 * fVar140;
          auVar163._8_4_ = fVar210 * fVar133;
          auVar163._12_4_ = fVar211 * fVar140;
          auVar126._0_4_ = fVar200 * fVar141;
          auVar126._4_4_ = fVar209 * fVar142;
          auVar126._8_4_ = fVar210 * fVar141;
          auVar126._12_4_ = fVar211 * fVar142;
          auVar54 = vfmadd231ps_fma(auVar145,auVar61,auVar57);
          auVar53 = vfmadd231ps_fma(auVar156,auVar61,auVar56);
          auVar60 = vfmadd231ps_fma(auVar163,auVar61,auVar55);
          auVar61 = vfmadd231ps_fma(auVar126,auVar117,auVar61);
          auVar138._16_16_ = auVar54;
          auVar138._0_16_ = auVar54;
          auVar151._16_16_ = auVar53;
          auVar151._0_16_ = auVar53;
          auVar160._16_16_ = auVar60;
          auVar160._0_16_ = auVar60;
          auVar77 = vpermps_avx512vl(auVar250._0_32_,ZEXT1632(auVar58));
          auVar79 = vsubps_avx(auVar151,auVar138);
          auVar53 = vfmadd213ps_fma(auVar79,auVar77,auVar138);
          auVar79 = vsubps_avx(auVar160,auVar151);
          auVar71 = vfmadd213ps_fma(auVar79,auVar77,auVar151);
          auVar54 = vsubps_avx(auVar61,auVar60);
          auVar152._16_16_ = auVar54;
          auVar152._0_16_ = auVar54;
          auVar54 = vfmadd213ps_fma(auVar152,auVar77,auVar160);
          auVar79 = vsubps_avx(ZEXT1632(auVar71),ZEXT1632(auVar53));
          auVar53 = vfmadd213ps_fma(auVar79,auVar77,ZEXT1632(auVar53));
          auVar79 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar71));
          auVar54 = vfmadd213ps_fma(auVar79,auVar77,ZEXT1632(auVar71));
          auVar79 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar53));
          auVar143 = vfmadd231ps_fma(ZEXT1632(auVar53),auVar79,auVar77);
          auVar79 = vmulps_avx512vl(auVar79,auVar247._0_32_);
          auVar96._16_16_ = auVar79._16_16_;
          fVar200 = fVar107 * 0.33333334;
          auVar164._0_8_ =
               CONCAT44(auVar143._4_4_ + fVar200 * auVar79._4_4_,
                        auVar143._0_4_ + fVar200 * auVar79._0_4_);
          auVar164._8_4_ = auVar143._8_4_ + fVar200 * auVar79._8_4_;
          auVar164._12_4_ = auVar143._12_4_ + fVar200 * auVar79._12_4_;
          auVar146._0_4_ = fVar200 * auVar79._16_4_;
          auVar146._4_4_ = fVar200 * auVar79._20_4_;
          auVar146._8_4_ = fVar200 * auVar79._24_4_;
          auVar146._12_4_ = fVar200 * auVar79._28_4_;
          auVar68 = vsubps_avx((undefined1  [16])0x0,auVar146);
          auVar71 = vshufpd_avx(auVar143,auVar143,3);
          auVar69 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar54 = vsubps_avx(auVar71,auVar143);
          auVar53 = vsubps_avx(auVar69,(undefined1  [16])0x0);
          auVar185._0_4_ = auVar54._0_4_ + auVar53._0_4_;
          auVar185._4_4_ = auVar54._4_4_ + auVar53._4_4_;
          auVar185._8_4_ = auVar54._8_4_ + auVar53._8_4_;
          auVar185._12_4_ = auVar54._12_4_ + auVar53._12_4_;
          auVar54 = vshufps_avx(auVar143,auVar143,0xb1);
          auVar53 = vshufps_avx(auVar164,auVar164,0xb1);
          auVar60 = vshufps_avx(auVar68,auVar68,0xb1);
          auVar61 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar235._4_4_ = auVar185._0_4_;
          auVar235._0_4_ = auVar185._0_4_;
          auVar235._8_4_ = auVar185._0_4_;
          auVar235._12_4_ = auVar185._0_4_;
          auVar64 = vshufps_avx(auVar185,auVar185,0x55);
          fVar200 = auVar64._0_4_;
          auVar195._0_4_ = auVar54._0_4_ * fVar200;
          fVar209 = auVar64._4_4_;
          auVar195._4_4_ = auVar54._4_4_ * fVar209;
          fVar210 = auVar64._8_4_;
          auVar195._8_4_ = auVar54._8_4_ * fVar210;
          fVar211 = auVar64._12_4_;
          auVar195._12_4_ = auVar54._12_4_ * fVar211;
          auVar202._0_4_ = auVar53._0_4_ * fVar200;
          auVar202._4_4_ = auVar53._4_4_ * fVar209;
          auVar202._8_4_ = auVar53._8_4_ * fVar210;
          auVar202._12_4_ = auVar53._12_4_ * fVar211;
          auVar214._0_4_ = auVar60._0_4_ * fVar200;
          auVar214._4_4_ = auVar60._4_4_ * fVar209;
          auVar214._8_4_ = auVar60._8_4_ * fVar210;
          auVar214._12_4_ = auVar60._12_4_ * fVar211;
          auVar186._0_4_ = auVar61._0_4_ * fVar200;
          auVar186._4_4_ = auVar61._4_4_ * fVar209;
          auVar186._8_4_ = auVar61._8_4_ * fVar210;
          auVar186._12_4_ = auVar61._12_4_ * fVar211;
          auVar54 = vfmadd231ps_fma(auVar195,auVar235,auVar143);
          auVar53 = vfmadd231ps_fma(auVar202,auVar235,auVar164);
          auVar66 = vfmadd231ps_fma(auVar214,auVar235,auVar68);
          auVar67 = vfmadd231ps_fma(auVar186,(undefined1  [16])0x0,auVar235);
          auVar64 = vshufpd_avx(auVar54,auVar54,1);
          auVar65 = vshufpd_avx(auVar53,auVar53,1);
          auVar62 = vshufpd_avx512vl(auVar66,auVar66,1);
          auVar63 = vshufpd_avx512vl(auVar67,auVar67,1);
          auVar60 = vminss_avx(auVar54,auVar53);
          auVar54 = vmaxss_avx(auVar53,auVar54);
          auVar61 = vminss_avx(auVar66,auVar67);
          auVar53 = vmaxss_avx(auVar67,auVar66);
          auVar60 = vminss_avx(auVar60,auVar61);
          auVar54 = vmaxss_avx(auVar53,auVar54);
          auVar61 = vminss_avx(auVar64,auVar65);
          auVar53 = vmaxss_avx(auVar65,auVar64);
          auVar64 = vminss_avx512f(auVar62,auVar63);
          auVar65 = vmaxss_avx512f(auVar63,auVar62);
          auVar53 = vmaxss_avx(auVar65,auVar53);
          auVar61 = vminss_avx512f(auVar61,auVar64);
          fVar209 = auVar53._0_4_;
          fVar200 = auVar54._0_4_;
          if (0.0001 <= auVar60._0_4_) {
LAB_01ccd309:
            vucomiss_avx512f(auVar61);
            bVar47 = fVar209 <= -0.0001;
            bVar45 = -0.0001 < fVar200;
            bVar44 = bVar47;
            if (!bVar47) goto LAB_01ccd35f;
            uVar15 = vcmpps_avx512vl(auVar60,SUB6416(ZEXT464(0x38d1b717),0),5);
            uVar16 = vcmpps_avx512vl(auVar61,SUB6416(ZEXT464(0x38d1b717),0),5);
            bVar34 = (byte)uVar15 & (byte)uVar16 & 1;
            bVar47 = bVar45 && bVar34 == 0;
            bVar44 = bVar45 && bVar34 == 0;
            if (bVar45 && bVar34 == 0) goto LAB_01ccd35f;
          }
          else {
            bVar47 = fVar209 == -0.0001;
            bVar44 = NAN(fVar209);
            if (fVar209 <= -0.0001) goto LAB_01ccd309;
LAB_01ccd35f:
            auVar66 = auVar252._0_16_;
            vcmpss_avx512f(auVar60,auVar66,1);
            uVar15 = vcmpss_avx512f(auVar54,auVar66,1);
            bVar45 = (bool)((byte)uVar15 & 1);
            auVar96._0_16_ = auVar253._0_16_;
            auVar95._4_28_ = auVar96._4_28_;
            auVar95._0_4_ = (float)((uint)bVar45 * -0x40800000 + (uint)!bVar45 * auVar253._0_4_);
            vucomiss_avx512f(auVar95._0_16_);
            bVar44 = (bool)(!bVar47 | bVar44);
            bVar45 = bVar44 == false;
            auVar98._16_16_ = auVar96._16_16_;
            auVar98._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar97._4_28_ = auVar98._4_28_;
            auVar97._0_4_ = (uint)bVar44 * auVar252._0_4_ + (uint)!bVar44 * 0x7f800000;
            auVar65 = auVar97._0_16_;
            auVar100._16_16_ = auVar96._16_16_;
            auVar100._0_16_ = SUB6416(ZEXT464(0xff800000),0);
            auVar99._4_28_ = auVar100._4_28_;
            auVar99._0_4_ = (uint)bVar44 * auVar252._0_4_ + (uint)!bVar44 * -0x800000;
            auVar64 = auVar99._0_16_;
            uVar15 = vcmpss_avx512f(auVar61,auVar66,1);
            bVar47 = (bool)((byte)uVar15 & 1);
            auVar102._16_16_ = auVar96._16_16_;
            auVar102._0_16_ = auVar253._0_16_;
            auVar101._4_28_ = auVar102._4_28_;
            auVar101._0_4_ = (float)((uint)bVar47 * -0x40800000 + (uint)!bVar47 * auVar253._0_4_);
            vucomiss_avx512f(auVar101._0_16_);
            if ((bVar44) || (bVar45)) {
              auVar61 = vucomiss_avx512f(auVar60);
              if ((bVar44) || (bVar45)) {
                auVar67 = vxorps_avx512vl(auVar60,auVar246._0_16_);
                auVar60 = vsubss_avx512f(auVar61,auVar60);
                auVar60 = vdivss_avx512f(auVar67,auVar60);
                auVar61 = vsubss_avx512f(ZEXT416(0x3f800000),auVar60);
                auVar61 = vfmadd213ss_avx512f(auVar61,auVar66,auVar60);
                auVar60 = auVar61;
              }
              else {
                auVar60 = vxorps_avx512vl(auVar61,auVar61);
                vucomiss_avx512f(auVar60);
                auVar61 = ZEXT416(0x3f800000);
                if ((bVar44) || (bVar45)) {
                  auVar61 = SUB6416(ZEXT464(0xff800000),0);
                  auVar60 = ZEXT416(0x7f800000);
                }
              }
              auVar65 = vminss_avx512f(auVar65,auVar60);
              auVar64 = vmaxss_avx(auVar61,auVar64);
            }
            auVar253 = ZEXT464(0x3f800000);
            uVar15 = vcmpss_avx512f(auVar53,auVar66,1);
            bVar47 = (bool)((byte)uVar15 & 1);
            auVar53 = auVar253._0_16_;
            fVar210 = (float)((uint)bVar47 * -0x40800000 + (uint)!bVar47 * 0x3f800000);
            if ((auVar95._0_4_ != fVar210) || (NAN(auVar95._0_4_) || NAN(fVar210))) {
              if ((fVar209 != fVar200) || (NAN(fVar209) || NAN(fVar200))) {
                auVar54 = vxorps_avx512vl(auVar54,auVar246._0_16_);
                auVar187._0_4_ = auVar54._0_4_ / (fVar209 - fVar200);
                auVar187._4_12_ = auVar54._4_12_;
                auVar54 = vsubss_avx512f(auVar53,auVar187);
                auVar54 = vfmadd213ss_avx512f(auVar54,auVar66,auVar187);
                auVar60 = auVar54;
              }
              else if ((fVar200 != 0.0) ||
                      (auVar54 = auVar53, auVar60 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar200))) {
                auVar54 = SUB6416(ZEXT464(0xff800000),0);
                auVar60 = SUB6416(ZEXT464(0x7f800000),0);
              }
              auVar65 = vminss_avx(auVar65,auVar60);
              auVar64 = vmaxss_avx(auVar54,auVar64);
            }
            bVar47 = auVar101._0_4_ != fVar210;
            auVar54 = vminss_avx512f(auVar65,auVar53);
            auVar104._16_16_ = auVar96._16_16_;
            auVar104._0_16_ = auVar65;
            auVar103._4_28_ = auVar104._4_28_;
            auVar103._0_4_ = (uint)bVar47 * auVar54._0_4_ + (uint)!bVar47 * auVar65._0_4_;
            auVar54 = vmaxss_avx512f(auVar53,auVar64);
            auVar106._16_16_ = auVar96._16_16_;
            auVar106._0_16_ = auVar64;
            auVar105._4_28_ = auVar106._4_28_;
            auVar105._0_4_ = (uint)bVar47 * auVar54._0_4_ + (uint)!bVar47 * auVar64._0_4_;
            auVar54 = vmaxss_avx512f(auVar66,auVar103._0_16_);
            auVar60 = vminss_avx512f(auVar105._0_16_,auVar53);
            if (auVar54._0_4_ <= auVar60._0_4_) {
              auVar66 = vmaxss_avx512f(auVar66,ZEXT416((uint)(auVar54._0_4_ + -0.1)));
              auVar67 = vminss_avx512f(ZEXT416((uint)(auVar60._0_4_ + 0.1)),auVar53);
              auVar127._0_8_ = auVar143._0_8_;
              auVar127._8_8_ = auVar127._0_8_;
              auVar203._8_8_ = auVar164._0_8_;
              auVar203._0_8_ = auVar164._0_8_;
              auVar215._8_8_ = auVar68._0_8_;
              auVar215._0_8_ = auVar68._0_8_;
              auVar54 = vshufpd_avx(auVar164,auVar164,3);
              auVar60 = vshufpd_avx(auVar68,auVar68,3);
              auVar61 = vshufps_avx(auVar66,auVar67,0);
              auVar65 = vsubps_avx512vl(auVar51,auVar61);
              fVar200 = auVar61._0_4_;
              auVar157._0_4_ = fVar200 * auVar71._0_4_;
              fVar209 = auVar61._4_4_;
              auVar157._4_4_ = fVar209 * auVar71._4_4_;
              fVar210 = auVar61._8_4_;
              auVar157._8_4_ = fVar210 * auVar71._8_4_;
              fVar211 = auVar61._12_4_;
              auVar157._12_4_ = fVar211 * auVar71._12_4_;
              auVar165._0_4_ = fVar200 * auVar54._0_4_;
              auVar165._4_4_ = fVar209 * auVar54._4_4_;
              auVar165._8_4_ = fVar210 * auVar54._8_4_;
              auVar165._12_4_ = fVar211 * auVar54._12_4_;
              auVar238._0_4_ = auVar60._0_4_ * fVar200;
              auVar238._4_4_ = auVar60._4_4_ * fVar209;
              auVar238._8_4_ = auVar60._8_4_ * fVar210;
              auVar238._12_4_ = auVar60._12_4_ * fVar211;
              auVar147._0_4_ = fVar200 * auVar69._0_4_;
              auVar147._4_4_ = fVar209 * auVar69._4_4_;
              auVar147._8_4_ = fVar210 * auVar69._8_4_;
              auVar147._12_4_ = fVar211 * auVar69._12_4_;
              auVar71 = vfmadd231ps_fma(auVar157,auVar65,auVar127);
              auVar69 = vfmadd231ps_fma(auVar165,auVar65,auVar203);
              auVar64 = vfmadd231ps_fma(auVar238,auVar65,auVar215);
              auVar65 = vfmadd231ps_fma(auVar147,auVar65,ZEXT816(0));
              auVar60 = vsubss_avx512f(auVar53,auVar66);
              auVar54 = vmovshdup_avx(auVar50);
              auVar143 = vfmadd231ss_fma(ZEXT416((uint)(auVar54._0_4_ * auVar66._0_4_)),auVar50,
                                         auVar60);
              auVar60 = vsubss_avx512f(auVar53,auVar67);
              auVar62 = vfmadd231ss_fma(ZEXT416((uint)(auVar54._0_4_ * auVar67._0_4_)),auVar50,
                                        auVar60);
              auVar68 = vdivss_avx512f(auVar53,ZEXT416((uint)fVar107));
              auVar54 = vsubps_avx(auVar69,auVar71);
              auVar66 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
              auVar60 = vmulps_avx512vl(auVar54,auVar66);
              auVar54 = vsubps_avx(auVar64,auVar69);
              auVar61 = vmulps_avx512vl(auVar54,auVar66);
              auVar54 = vsubps_avx(auVar65,auVar64);
              auVar54 = vmulps_avx512vl(auVar54,auVar66);
              auVar50 = vminps_avx(auVar61,auVar54);
              auVar54 = vmaxps_avx(auVar61,auVar54);
              auVar50 = vminps_avx(auVar60,auVar50);
              auVar54 = vmaxps_avx(auVar60,auVar54);
              auVar60 = vshufpd_avx(auVar50,auVar50,3);
              auVar61 = vshufpd_avx(auVar54,auVar54,3);
              auVar50 = vminps_avx(auVar50,auVar60);
              auVar54 = vmaxps_avx(auVar54,auVar61);
              fVar107 = auVar68._0_4_;
              auVar188._0_4_ = auVar50._0_4_ * fVar107;
              auVar188._4_4_ = auVar50._4_4_ * fVar107;
              auVar188._8_4_ = auVar50._8_4_ * fVar107;
              auVar188._12_4_ = auVar50._12_4_ * fVar107;
              auVar173._0_4_ = fVar107 * auVar54._0_4_;
              auVar173._4_4_ = fVar107 * auVar54._4_4_;
              auVar173._8_4_ = fVar107 * auVar54._8_4_;
              auVar173._12_4_ = fVar107 * auVar54._12_4_;
              auVar68 = vdivss_avx512f(auVar53,ZEXT416((uint)(auVar62._0_4_ - auVar143._0_4_)));
              auVar54 = vshufpd_avx(auVar71,auVar71,3);
              auVar50 = vshufpd_avx(auVar69,auVar69,3);
              auVar60 = vshufpd_avx(auVar64,auVar64,3);
              auVar61 = vshufpd_avx(auVar65,auVar65,3);
              auVar54 = vsubps_avx(auVar54,auVar71);
              auVar71 = vsubps_avx(auVar50,auVar69);
              auVar69 = vsubps_avx(auVar60,auVar64);
              auVar61 = vsubps_avx(auVar61,auVar65);
              auVar50 = vminps_avx(auVar54,auVar71);
              auVar54 = vmaxps_avx(auVar54,auVar71);
              auVar60 = vminps_avx(auVar69,auVar61);
              auVar60 = vminps_avx(auVar50,auVar60);
              auVar50 = vmaxps_avx(auVar69,auVar61);
              auVar54 = vmaxps_avx(auVar54,auVar50);
              fVar107 = auVar68._0_4_;
              auVar216._0_4_ = fVar107 * auVar60._0_4_;
              auVar216._4_4_ = fVar107 * auVar60._4_4_;
              auVar216._8_4_ = fVar107 * auVar60._8_4_;
              auVar216._12_4_ = fVar107 * auVar60._12_4_;
              auVar204._0_4_ = fVar107 * auVar54._0_4_;
              auVar204._4_4_ = fVar107 * auVar54._4_4_;
              auVar204._8_4_ = fVar107 * auVar54._8_4_;
              auVar204._12_4_ = fVar107 * auVar54._12_4_;
              auVar61 = vinsertps_avx(auVar58,auVar143,0x10);
              auVar63 = vpermt2ps_avx512vl(auVar58,_DAT_01feecd0,auVar62);
              auVar118._0_4_ = auVar61._0_4_ + auVar63._0_4_;
              auVar118._4_4_ = auVar61._4_4_ + auVar63._4_4_;
              auVar118._8_4_ = auVar61._8_4_ + auVar63._8_4_;
              auVar118._12_4_ = auVar61._12_4_ + auVar63._12_4_;
              auVar68 = vmulps_avx512vl(auVar118,auVar244._0_16_);
              auVar50 = vshufps_avx(auVar68,auVar68,0x54);
              uVar115 = auVar68._0_4_;
              auVar120._4_4_ = uVar115;
              auVar120._0_4_ = uVar115;
              auVar120._8_4_ = uVar115;
              auVar120._12_4_ = uVar115;
              auVar69 = vfmadd213ps_avx512vl(auVar48,auVar120,auVar3);
              auVar60 = vfmadd213ps_fma(auVar59,auVar120,local_440);
              auVar71 = vfmadd213ps_fma(local_2b0,auVar120,local_450);
              auVar54 = vsubps_avx(auVar60,auVar69);
              auVar69 = vfmadd213ps_fma(auVar54,auVar120,auVar69);
              auVar54 = vsubps_avx(auVar71,auVar60);
              auVar54 = vfmadd213ps_fma(auVar54,auVar120,auVar60);
              auVar54 = vsubps_avx(auVar54,auVar69);
              auVar60 = vfmadd231ps_fma(auVar69,auVar54,auVar120);
              auVar64 = vmulps_avx512vl(auVar54,auVar66);
              auVar226._8_8_ = auVar60._0_8_;
              auVar226._0_8_ = auVar60._0_8_;
              auVar54 = vshufpd_avx(auVar60,auVar60,3);
              auVar60 = vshufps_avx(auVar68,auVar68,0x55);
              auVar71 = vsubps_avx(auVar54,auVar226);
              auVar69 = vfmadd231ps_fma(auVar226,auVar60,auVar71);
              auVar239._8_8_ = auVar64._0_8_;
              auVar239._0_8_ = auVar64._0_8_;
              auVar54 = vshufpd_avx(auVar64,auVar64,3);
              auVar54 = vsubps_avx512vl(auVar54,auVar239);
              auVar54 = vfmadd213ps_avx512vl(auVar54,auVar60,auVar239);
              auVar121._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
              auVar121._8_4_ = auVar71._8_4_ ^ 0x80000000;
              auVar121._12_4_ = auVar71._12_4_ ^ 0x80000000;
              auVar60 = vmovshdup_avx512vl(auVar54);
              auVar240._0_8_ = auVar60._0_8_ ^ 0x8000000080000000;
              auVar240._8_4_ = auVar60._8_4_ ^ 0x80000000;
              auVar240._12_4_ = auVar60._12_4_ ^ 0x80000000;
              auVar64 = vmovshdup_avx512vl(auVar71);
              auVar65 = vpermt2ps_avx512vl(auVar240,ZEXT416(5),auVar71);
              auVar70 = vxorps_avx512vl(ZEXT416(5),ZEXT416(5));
              auVar252 = ZEXT1664(auVar70);
              auVar60 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar60._0_4_ * auVar71._0_4_)),auVar54,
                                            auVar64);
              auVar71 = vpermt2ps_avx512vl(auVar54,SUB6416(ZEXT464(4),0),auVar121);
              auVar148._0_4_ = auVar60._0_4_;
              auVar148._4_4_ = auVar148._0_4_;
              auVar148._8_4_ = auVar148._0_4_;
              auVar148._12_4_ = auVar148._0_4_;
              auVar54 = vdivps_avx(auVar65,auVar148);
              auVar72 = vdivps_avx512vl(auVar71,auVar148);
              fVar107 = auVar69._0_4_;
              auVar60 = vshufps_avx(auVar69,auVar69,0x55);
              auVar227._0_4_ = fVar107 * auVar54._0_4_ + auVar60._0_4_ * auVar72._0_4_;
              auVar227._4_4_ = fVar107 * auVar54._4_4_ + auVar60._4_4_ * auVar72._4_4_;
              auVar227._8_4_ = fVar107 * auVar54._8_4_ + auVar60._8_4_ * auVar72._8_4_;
              auVar227._12_4_ = fVar107 * auVar54._12_4_ + auVar60._12_4_ * auVar72._12_4_;
              auVar66 = vsubps_avx(auVar50,auVar227);
              auVar60 = vmovshdup_avx(auVar54);
              auVar50 = vinsertps_avx(auVar188,auVar216,0x1c);
              auVar241._0_4_ = auVar60._0_4_ * auVar50._0_4_;
              auVar241._4_4_ = auVar60._4_4_ * auVar50._4_4_;
              auVar241._8_4_ = auVar60._8_4_ * auVar50._8_4_;
              auVar241._12_4_ = auVar60._12_4_ * auVar50._12_4_;
              auVar67 = vinsertps_avx512f(auVar173,auVar204,0x1c);
              auVar60 = vmulps_avx512vl(auVar60,auVar67);
              auVar65 = vminps_avx512vl(auVar241,auVar60);
              auVar69 = vmaxps_avx(auVar60,auVar241);
              auVar64 = vmovshdup_avx(auVar72);
              auVar60 = vinsertps_avx(auVar216,auVar188,0x4c);
              auVar217._0_4_ = auVar64._0_4_ * auVar60._0_4_;
              auVar217._4_4_ = auVar64._4_4_ * auVar60._4_4_;
              auVar217._8_4_ = auVar64._8_4_ * auVar60._8_4_;
              auVar217._12_4_ = auVar64._12_4_ * auVar60._12_4_;
              auVar71 = vinsertps_avx(auVar204,auVar173,0x4c);
              auVar205._0_4_ = auVar64._0_4_ * auVar71._0_4_;
              auVar205._4_4_ = auVar64._4_4_ * auVar71._4_4_;
              auVar205._8_4_ = auVar64._8_4_ * auVar71._8_4_;
              auVar205._12_4_ = auVar64._12_4_ * auVar71._12_4_;
              auVar64 = vminps_avx(auVar217,auVar205);
              auVar65 = vaddps_avx512vl(auVar65,auVar64);
              auVar64 = vmaxps_avx(auVar205,auVar217);
              auVar206._0_4_ = auVar69._0_4_ + auVar64._0_4_;
              auVar206._4_4_ = auVar69._4_4_ + auVar64._4_4_;
              auVar206._8_4_ = auVar69._8_4_ + auVar64._8_4_;
              auVar206._12_4_ = auVar69._12_4_ + auVar64._12_4_;
              auVar218._8_8_ = 0x3f80000000000000;
              auVar218._0_8_ = 0x3f80000000000000;
              auVar69 = vsubps_avx(auVar218,auVar206);
              auVar64 = vsubps_avx(auVar218,auVar65);
              auVar65 = vsubps_avx(auVar61,auVar68);
              auVar68 = vsubps_avx(auVar63,auVar68);
              fVar211 = auVar65._0_4_;
              auVar242._0_4_ = fVar211 * auVar69._0_4_;
              fVar222 = auVar65._4_4_;
              auVar242._4_4_ = fVar222 * auVar69._4_4_;
              fVar223 = auVar65._8_4_;
              auVar242._8_4_ = fVar223 * auVar69._8_4_;
              fVar224 = auVar65._12_4_;
              auVar242._12_4_ = fVar224 * auVar69._12_4_;
              auVar73 = vbroadcastss_avx512vl(auVar54);
              auVar50 = vmulps_avx512vl(auVar73,auVar50);
              auVar67 = vmulps_avx512vl(auVar73,auVar67);
              auVar73 = vminps_avx512vl(auVar50,auVar67);
              auVar67 = vmaxps_avx512vl(auVar67,auVar50);
              auVar50 = vbroadcastss_avx512vl(auVar72);
              auVar60 = vmulps_avx512vl(auVar50,auVar60);
              auVar50 = vmulps_avx512vl(auVar50,auVar71);
              auVar71 = vminps_avx512vl(auVar60,auVar50);
              auVar71 = vaddps_avx512vl(auVar73,auVar71);
              auVar65 = vmulps_avx512vl(auVar65,auVar64);
              fVar107 = auVar68._0_4_;
              auVar207._0_4_ = fVar107 * auVar69._0_4_;
              fVar200 = auVar68._4_4_;
              auVar207._4_4_ = fVar200 * auVar69._4_4_;
              fVar209 = auVar68._8_4_;
              auVar207._8_4_ = fVar209 * auVar69._8_4_;
              fVar210 = auVar68._12_4_;
              auVar207._12_4_ = fVar210 * auVar69._12_4_;
              auVar219._0_4_ = fVar107 * auVar64._0_4_;
              auVar219._4_4_ = fVar200 * auVar64._4_4_;
              auVar219._8_4_ = fVar209 * auVar64._8_4_;
              auVar219._12_4_ = fVar210 * auVar64._12_4_;
              auVar50 = vmaxps_avx(auVar50,auVar60);
              auVar174._0_4_ = auVar67._0_4_ + auVar50._0_4_;
              auVar174._4_4_ = auVar67._4_4_ + auVar50._4_4_;
              auVar174._8_4_ = auVar67._8_4_ + auVar50._8_4_;
              auVar174._12_4_ = auVar67._12_4_ + auVar50._12_4_;
              auVar189._8_8_ = 0x3f800000;
              auVar189._0_8_ = 0x3f800000;
              auVar50 = vsubps_avx(auVar189,auVar174);
              auVar60 = vsubps_avx512vl(auVar189,auVar71);
              auVar236._0_4_ = fVar211 * auVar50._0_4_;
              auVar236._4_4_ = fVar222 * auVar50._4_4_;
              auVar236._8_4_ = fVar223 * auVar50._8_4_;
              auVar236._12_4_ = fVar224 * auVar50._12_4_;
              auVar228._0_4_ = fVar211 * auVar60._0_4_;
              auVar228._4_4_ = fVar222 * auVar60._4_4_;
              auVar228._8_4_ = fVar223 * auVar60._8_4_;
              auVar228._12_4_ = fVar224 * auVar60._12_4_;
              auVar175._0_4_ = fVar107 * auVar50._0_4_;
              auVar175._4_4_ = fVar200 * auVar50._4_4_;
              auVar175._8_4_ = fVar209 * auVar50._8_4_;
              auVar175._12_4_ = fVar210 * auVar50._12_4_;
              auVar190._0_4_ = fVar107 * auVar60._0_4_;
              auVar190._4_4_ = fVar200 * auVar60._4_4_;
              auVar190._8_4_ = fVar209 * auVar60._8_4_;
              auVar190._12_4_ = fVar210 * auVar60._12_4_;
              auVar50 = vminps_avx(auVar236,auVar228);
              auVar60 = vminps_avx512vl(auVar175,auVar190);
              auVar71 = vminps_avx512vl(auVar50,auVar60);
              auVar50 = vmaxps_avx(auVar228,auVar236);
              auVar60 = vmaxps_avx(auVar190,auVar175);
              auVar60 = vmaxps_avx(auVar60,auVar50);
              auVar69 = vminps_avx512vl(auVar242,auVar65);
              auVar50 = vminps_avx(auVar207,auVar219);
              auVar50 = vminps_avx(auVar69,auVar50);
              auVar50 = vhaddps_avx(auVar71,auVar50);
              auVar69 = vmaxps_avx512vl(auVar65,auVar242);
              auVar71 = vmaxps_avx(auVar219,auVar207);
              auVar71 = vmaxps_avx(auVar71,auVar69);
              auVar60 = vhaddps_avx(auVar60,auVar71);
              auVar50 = vshufps_avx(auVar50,auVar50,0xe8);
              auVar60 = vshufps_avx(auVar60,auVar60,0xe8);
              auVar176._0_4_ = auVar50._0_4_ + auVar66._0_4_;
              auVar176._4_4_ = auVar50._4_4_ + auVar66._4_4_;
              auVar176._8_4_ = auVar50._8_4_ + auVar66._8_4_;
              auVar176._12_4_ = auVar50._12_4_ + auVar66._12_4_;
              auVar191._0_4_ = auVar60._0_4_ + auVar66._0_4_;
              auVar191._4_4_ = auVar60._4_4_ + auVar66._4_4_;
              auVar191._8_4_ = auVar60._8_4_ + auVar66._8_4_;
              auVar191._12_4_ = auVar60._12_4_ + auVar66._12_4_;
              auVar50 = vmaxps_avx(auVar61,auVar176);
              auVar60 = vminps_avx(auVar191,auVar63);
              uVar42 = vcmpps_avx512vl(auVar60,auVar50,1);
              if ((uVar42 & 3) == 0) {
                uVar42 = vcmpps_avx512vl(auVar191,auVar63,1);
                uVar15 = vcmpps_avx512vl(auVar58,auVar176,1);
                if (((ushort)uVar15 & (ushort)uVar42 & 1) == 0) {
                  bVar34 = 0;
                }
                else {
                  auVar50 = vmovshdup_avx(auVar176);
                  bVar34 = auVar143._0_4_ < auVar50._0_4_ & (byte)(uVar42 >> 1) & 0x7f;
                }
                if (((3 < (uint)uVar36 || uVar7 != 0 && !bVar46) | bVar34) != 1) {
                  auVar50 = vinsertps_avx(auVar143,auVar62,0x10);
                  goto LAB_01cccbd0;
                }
                lVar38 = 200;
                do {
                  auVar58 = vsubss_avx512f(auVar53,auVar66);
                  fVar209 = auVar58._0_4_;
                  fVar107 = fVar209 * fVar209 * fVar209;
                  fVar210 = auVar66._0_4_;
                  fVar200 = fVar210 * 3.0 * fVar209 * fVar209;
                  fVar209 = fVar209 * fVar210 * fVar210 * 3.0;
                  auVar135._4_4_ = fVar107;
                  auVar135._0_4_ = fVar107;
                  auVar135._8_4_ = fVar107;
                  auVar135._12_4_ = fVar107;
                  auVar128._4_4_ = fVar200;
                  auVar128._0_4_ = fVar200;
                  auVar128._8_4_ = fVar200;
                  auVar128._12_4_ = fVar200;
                  auVar109._4_4_ = fVar209;
                  auVar109._0_4_ = fVar209;
                  auVar109._8_4_ = fVar209;
                  auVar109._12_4_ = fVar209;
                  fVar210 = fVar210 * fVar210 * fVar210;
                  auVar158._0_4_ = fVar210 * (float)local_290._0_4_;
                  auVar158._4_4_ = fVar210 * (float)local_290._4_4_;
                  auVar158._8_4_ = fVar210 * fStack_288;
                  auVar158._12_4_ = fVar210 * fStack_284;
                  auVar58 = vfmadd231ps_fma(auVar158,local_450,auVar109);
                  auVar58 = vfmadd231ps_fma(auVar58,local_440,auVar128);
                  auVar58 = vfmadd231ps_fma(auVar58,auVar3,auVar135);
                  auVar110._8_8_ = auVar58._0_8_;
                  auVar110._0_8_ = auVar58._0_8_;
                  auVar58 = vshufpd_avx(auVar58,auVar58,3);
                  auVar50 = vshufps_avx(auVar66,auVar66,0x55);
                  auVar58 = vsubps_avx(auVar58,auVar110);
                  auVar50 = vfmadd213ps_fma(auVar58,auVar50,auVar110);
                  fVar107 = auVar50._0_4_;
                  auVar58 = vshufps_avx(auVar50,auVar50,0x55);
                  auVar111._0_4_ = auVar54._0_4_ * fVar107 + auVar72._0_4_ * auVar58._0_4_;
                  auVar111._4_4_ = auVar54._4_4_ * fVar107 + auVar72._4_4_ * auVar58._4_4_;
                  auVar111._8_4_ = auVar54._8_4_ * fVar107 + auVar72._8_4_ * auVar58._8_4_;
                  auVar111._12_4_ = auVar54._12_4_ * fVar107 + auVar72._12_4_ * auVar58._12_4_;
                  auVar66 = vsubps_avx(auVar66,auVar111);
                  auVar58 = vandps_avx512vl(auVar50,auVar245._0_16_);
                  auVar50 = vprolq_avx512vl(auVar58,0x20);
                  auVar58 = vmaxss_avx(auVar50,auVar58);
                  bVar46 = (float)local_2a0._0_4_ < auVar58._0_4_;
                  if (auVar58._0_4_ < (float)local_2a0._0_4_) {
                    auVar58 = vucomiss_avx512f(auVar70);
                    if (bVar46) break;
                    auVar54 = vucomiss_avx512f(auVar58);
                    auVar253 = ZEXT1664(auVar54);
                    if (bVar46) break;
                    vmovshdup_avx(auVar58);
                    auVar54 = vucomiss_avx512f(auVar70);
                    if (bVar46) break;
                    auVar50 = vucomiss_avx512f(auVar54);
                    auVar253 = ZEXT1664(auVar50);
                    if (bVar46) break;
                    auVar53 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar68 = vinsertps_avx(auVar53,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                  [2]),0x28);
                    auVar53 = vdpps_avx(auVar68,local_2c0,0x7f);
                    auVar60 = vdpps_avx(auVar68,local_2d0,0x7f);
                    auVar61 = vdpps_avx(auVar68,local_2e0,0x7f);
                    auVar71 = vdpps_avx(auVar68,local_2f0,0x7f);
                    auVar69 = vdpps_avx(auVar68,local_300,0x7f);
                    auVar64 = vdpps_avx(auVar68,local_310,0x7f);
                    auVar65 = vdpps_avx(auVar68,local_320,0x7f);
                    auVar68 = vdpps_avx(auVar68,local_330,0x7f);
                    auVar66 = vsubss_avx512f(auVar50,auVar54);
                    fVar210 = auVar54._0_4_;
                    auVar54 = vfmadd231ss_fma(ZEXT416((uint)(fVar210 * auVar69._0_4_)),auVar66,
                                              auVar53);
                    auVar53 = vfmadd231ss_fma(ZEXT416((uint)(auVar64._0_4_ * fVar210)),auVar66,
                                              auVar60);
                    auVar60 = vfmadd231ss_fma(ZEXT416((uint)(auVar65._0_4_ * fVar210)),auVar66,
                                              auVar61);
                    auVar61 = vfmadd231ss_fma(ZEXT416((uint)(fVar210 * auVar68._0_4_)),auVar66,
                                              auVar71);
                    auVar50 = vsubss_avx512f(auVar50,auVar58);
                    auVar166._0_4_ = auVar50._0_4_;
                    fVar107 = auVar166._0_4_ * auVar166._0_4_ * auVar166._0_4_;
                    local_120 = auVar58._0_4_;
                    fVar200 = local_120 * 3.0 * auVar166._0_4_ * auVar166._0_4_;
                    fVar209 = auVar166._0_4_ * local_120 * local_120 * 3.0;
                    fVar222 = local_120 * local_120 * local_120;
                    auVar50 = vfmadd231ss_fma(ZEXT416((uint)(fVar222 * auVar61._0_4_)),
                                              ZEXT416((uint)fVar209),auVar60);
                    auVar50 = vfmadd231ss_fma(auVar50,ZEXT416((uint)fVar200),auVar53);
                    auVar54 = vfmadd231ss_fma(auVar50,ZEXT416((uint)fVar107),auVar54);
                    fVar211 = auVar54._0_4_;
                    if ((fVar211 < fVar125) ||
                       (fVar223 = *(float *)(ray + k * 4 + 0x100), fVar223 < fVar211)) break;
                    auVar54 = vshufps_avx(auVar58,auVar58,0x55);
                    auVar53 = vsubps_avx512vl(auVar51,auVar54);
                    fVar224 = auVar54._0_4_;
                    auVar196._0_4_ = fVar224 * (float)local_350._0_4_;
                    fVar225 = auVar54._4_4_;
                    auVar196._4_4_ = fVar225 * (float)local_350._4_4_;
                    fVar230 = auVar54._8_4_;
                    auVar196._8_4_ = fVar230 * fStack_348;
                    fVar231 = auVar54._12_4_;
                    auVar196._12_4_ = fVar231 * fStack_344;
                    auVar208._0_4_ = fVar224 * (float)local_3a0._0_4_;
                    auVar208._4_4_ = fVar225 * (float)local_3a0._4_4_;
                    auVar208._8_4_ = fVar230 * fStack_398;
                    auVar208._12_4_ = fVar231 * fStack_394;
                    auVar220._0_4_ = fVar224 * (float)local_3b0._0_4_;
                    auVar220._4_4_ = fVar225 * (float)local_3b0._4_4_;
                    auVar220._8_4_ = fVar230 * fStack_3a8;
                    auVar220._12_4_ = fVar231 * fStack_3a4;
                    auVar177._0_4_ = fVar224 * (float)local_370._0_4_;
                    auVar177._4_4_ = fVar225 * (float)local_370._4_4_;
                    auVar177._8_4_ = fVar230 * fStack_368;
                    auVar177._12_4_ = fVar231 * fStack_364;
                    auVar54 = vfmadd231ps_fma(auVar196,auVar53,local_340);
                    auVar50 = vfmadd231ps_fma(auVar208,auVar53,local_380);
                    auVar51 = vfmadd231ps_fma(auVar220,auVar53,local_390);
                    auVar53 = vfmadd231ps_fma(auVar177,auVar53,local_360);
                    auVar54 = vsubps_avx(auVar50,auVar54);
                    auVar50 = vsubps_avx(auVar51,auVar50);
                    auVar51 = vsubps_avx(auVar53,auVar51);
                    auVar221._0_4_ = local_120 * auVar50._0_4_;
                    auVar221._4_4_ = local_120 * auVar50._4_4_;
                    auVar221._8_4_ = local_120 * auVar50._8_4_;
                    auVar221._12_4_ = local_120 * auVar50._12_4_;
                    auVar166._4_4_ = auVar166._0_4_;
                    auVar166._8_4_ = auVar166._0_4_;
                    auVar166._12_4_ = auVar166._0_4_;
                    auVar54 = vfmadd231ps_fma(auVar221,auVar166,auVar54);
                    auVar178._0_4_ = local_120 * auVar51._0_4_;
                    auVar178._4_4_ = local_120 * auVar51._4_4_;
                    auVar178._8_4_ = local_120 * auVar51._8_4_;
                    auVar178._12_4_ = local_120 * auVar51._12_4_;
                    auVar50 = vfmadd231ps_fma(auVar178,auVar166,auVar50);
                    auVar179._0_4_ = local_120 * auVar50._0_4_;
                    auVar179._4_4_ = local_120 * auVar50._4_4_;
                    auVar179._8_4_ = local_120 * auVar50._8_4_;
                    auVar179._12_4_ = local_120 * auVar50._12_4_;
                    auVar54 = vfmadd231ps_fma(auVar179,auVar166,auVar54);
                    auVar19._8_4_ = 0x40400000;
                    auVar19._0_8_ = 0x4040000040400000;
                    auVar19._12_4_ = 0x40400000;
                    auVar54 = vmulps_avx512vl(auVar54,auVar19);
                    pGVar8 = (context->scene->geometries).items[uVar43].ptr;
                    if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                    auVar159._0_4_ = fVar222 * (float)local_3f0._0_4_;
                    auVar159._4_4_ = fVar222 * (float)local_3f0._4_4_;
                    auVar159._8_4_ = fVar222 * fStack_3e8;
                    auVar159._12_4_ = fVar222 * fStack_3e4;
                    auVar149._4_4_ = fVar209;
                    auVar149._0_4_ = fVar209;
                    auVar149._8_4_ = fVar209;
                    auVar149._12_4_ = fVar209;
                    auVar50 = vfmadd132ps_fma(auVar149,auVar159,local_3e0);
                    auVar136._4_4_ = fVar200;
                    auVar136._0_4_ = fVar200;
                    auVar136._8_4_ = fVar200;
                    auVar136._12_4_ = fVar200;
                    auVar50 = vfmadd132ps_fma(auVar136,auVar50,local_3d0);
                    auVar129._4_4_ = fVar107;
                    auVar129._0_4_ = fVar107;
                    auVar129._8_4_ = fVar107;
                    auVar129._12_4_ = fVar107;
                    auVar53 = vfmadd132ps_fma(auVar129,auVar50,local_3c0);
                    auVar50 = vshufps_avx(auVar53,auVar53,0xc9);
                    auVar51 = vshufps_avx(auVar54,auVar54,0xc9);
                    auVar130._0_4_ = auVar53._0_4_ * auVar51._0_4_;
                    auVar130._4_4_ = auVar53._4_4_ * auVar51._4_4_;
                    auVar130._8_4_ = auVar53._8_4_ * auVar51._8_4_;
                    auVar130._12_4_ = auVar53._12_4_ * auVar51._12_4_;
                    auVar54 = vfmsub231ps_fma(auVar130,auVar54,auVar50);
                    local_140 = auVar54._0_4_;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar211;
                      uVar115 = vextractps_avx(auVar54,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar115;
                      uVar115 = vextractps_avx(auVar54,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar115;
                      *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                      *(float *)(ray + k * 4 + 0x1e0) = local_120;
                      *(float *)(ray + k * 4 + 0x200) = fVar210;
                      *(uint *)(ray + k * 4 + 0x220) = uVar6;
                      *(uint *)(ray + k * 4 + 0x240) = uVar43;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    auVar139._8_4_ = 1;
                    auVar139._0_8_ = 0x100000001;
                    auVar139._12_4_ = 1;
                    auVar139._16_4_ = 1;
                    auVar139._20_4_ = 1;
                    auVar139._24_4_ = 1;
                    auVar139._28_4_ = 1;
                    local_100 = vpermps_avx2(auVar139,ZEXT1632(auVar58));
                    auVar79 = vpermps_avx2(auVar139,ZEXT1632(auVar54));
                    local_160 = vpermps_avx512vl(auVar251._0_32_,ZEXT1632(auVar54));
                    local_180[0] = (RTCHitN)auVar79[0];
                    local_180[1] = (RTCHitN)auVar79[1];
                    local_180[2] = (RTCHitN)auVar79[2];
                    local_180[3] = (RTCHitN)auVar79[3];
                    local_180[4] = (RTCHitN)auVar79[4];
                    local_180[5] = (RTCHitN)auVar79[5];
                    local_180[6] = (RTCHitN)auVar79[6];
                    local_180[7] = (RTCHitN)auVar79[7];
                    local_180[8] = (RTCHitN)auVar79[8];
                    local_180[9] = (RTCHitN)auVar79[9];
                    local_180[10] = (RTCHitN)auVar79[10];
                    local_180[0xb] = (RTCHitN)auVar79[0xb];
                    local_180[0xc] = (RTCHitN)auVar79[0xc];
                    local_180[0xd] = (RTCHitN)auVar79[0xd];
                    local_180[0xe] = (RTCHitN)auVar79[0xe];
                    local_180[0xf] = (RTCHitN)auVar79[0xf];
                    local_180[0x10] = (RTCHitN)auVar79[0x10];
                    local_180[0x11] = (RTCHitN)auVar79[0x11];
                    local_180[0x12] = (RTCHitN)auVar79[0x12];
                    local_180[0x13] = (RTCHitN)auVar79[0x13];
                    local_180[0x14] = (RTCHitN)auVar79[0x14];
                    local_180[0x15] = (RTCHitN)auVar79[0x15];
                    local_180[0x16] = (RTCHitN)auVar79[0x16];
                    local_180[0x17] = (RTCHitN)auVar79[0x17];
                    local_180[0x18] = (RTCHitN)auVar79[0x18];
                    local_180[0x19] = (RTCHitN)auVar79[0x19];
                    local_180[0x1a] = (RTCHitN)auVar79[0x1a];
                    local_180[0x1b] = (RTCHitN)auVar79[0x1b];
                    local_180[0x1c] = (RTCHitN)auVar79[0x1c];
                    local_180[0x1d] = (RTCHitN)auVar79[0x1d];
                    local_180[0x1e] = (RTCHitN)auVar79[0x1e];
                    local_180[0x1f] = (RTCHitN)auVar79[0x1f];
                    uStack_13c = local_140;
                    uStack_138 = local_140;
                    uStack_134 = local_140;
                    uStack_130 = local_140;
                    uStack_12c = local_140;
                    uStack_128 = local_140;
                    uStack_124 = local_140;
                    fStack_11c = local_120;
                    fStack_118 = local_120;
                    fStack_114 = local_120;
                    fStack_110 = local_120;
                    fStack_10c = local_120;
                    fStack_108 = local_120;
                    fStack_104 = local_120;
                    local_e0 = local_200._0_8_;
                    uStack_d8 = local_200._8_8_;
                    uStack_d0 = local_200._16_8_;
                    uStack_c8 = local_200._24_8_;
                    local_c0 = local_1e0;
                    vpcmpeqd_avx2(local_1e0,local_1e0);
                    uStack_9c = context->user->instID[0];
                    local_a0 = uStack_9c;
                    uStack_98 = uStack_9c;
                    uStack_94 = uStack_9c;
                    uStack_90 = uStack_9c;
                    uStack_8c = uStack_9c;
                    uStack_88 = uStack_9c;
                    uStack_84 = uStack_9c;
                    uStack_7c = context->user->instPrimID[0];
                    local_80 = uStack_7c;
                    uStack_78 = uStack_7c;
                    uStack_74 = uStack_7c;
                    uStack_70 = uStack_7c;
                    uStack_6c = uStack_7c;
                    uStack_68 = uStack_7c;
                    uStack_64 = uStack_7c;
                    *(float *)(ray + k * 4 + 0x100) = fVar211;
                    local_420 = local_220;
                    local_480.valid = (int *)local_420;
                    local_480.geometryUserPtr = pGVar8->userPtr;
                    local_480.context = context->user;
                    local_480.hit = local_180;
                    local_480.N = 8;
                    local_480.ray = (RTCRayN *)ray;
                    if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar8->intersectionFilterN)(&local_480);
                      auVar58 = vxorps_avx512vl(auVar70,auVar70);
                      auVar252 = ZEXT1664(auVar58);
                      auVar253 = ZEXT464(0x3f800000);
                      auVar250 = ZEXT3264(_DAT_01feed20);
                      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar249 = ZEXT1664(auVar58);
                      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar248 = ZEXT1664(auVar58);
                      auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar247 = ZEXT3264(auVar79);
                      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar246 = ZEXT1664(auVar58);
                      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar245 = ZEXT1664(auVar58);
                      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                      auVar244 = ZEXT1664(auVar58);
                      auVar79 = vbroadcastss_avx512vl(ZEXT416(2));
                      auVar251 = ZEXT3264(auVar79);
                    }
                    auVar58 = auVar252._0_16_;
                    if (local_420 != (undefined1  [32])0x0) {
                      p_Var9 = context->args->filter;
                      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var9)(&local_480);
                        auVar58 = vxorps_avx512vl(auVar58,auVar58);
                        auVar252 = ZEXT1664(auVar58);
                        auVar253 = ZEXT464(0x3f800000);
                        auVar250 = ZEXT3264(_DAT_01feed20);
                        auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar249 = ZEXT1664(auVar58);
                        auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                        auVar248 = ZEXT1664(auVar58);
                        auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar247 = ZEXT3264(auVar79);
                        auVar58 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar246 = ZEXT1664(auVar58);
                        auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar245 = ZEXT1664(auVar58);
                        auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                        auVar244 = ZEXT1664(auVar58);
                        auVar79 = vbroadcastss_avx512vl(ZEXT416(2));
                        auVar251 = ZEXT3264(auVar79);
                      }
                      if (local_420 != (undefined1  [32])0x0) {
                        uVar42 = vptestmd_avx512vl(local_420,local_420);
                        iVar27 = *(int *)(local_480.hit + 4);
                        iVar28 = *(int *)(local_480.hit + 8);
                        iVar29 = *(int *)(local_480.hit + 0xc);
                        iVar30 = *(int *)(local_480.hit + 0x10);
                        iVar31 = *(int *)(local_480.hit + 0x14);
                        iVar32 = *(int *)(local_480.hit + 0x18);
                        iVar33 = *(int *)(local_480.hit + 0x1c);
                        bVar34 = (byte)uVar42;
                        bVar46 = (bool)((byte)(uVar42 >> 1) & 1);
                        bVar47 = (bool)((byte)(uVar42 >> 2) & 1);
                        bVar44 = (bool)((byte)(uVar42 >> 3) & 1);
                        bVar45 = (bool)((byte)(uVar42 >> 4) & 1);
                        bVar12 = (bool)((byte)(uVar42 >> 5) & 1);
                        bVar13 = (bool)((byte)(uVar42 >> 6) & 1);
                        bVar14 = SUB81(uVar42 >> 7,0);
                        *(uint *)(local_480.ray + 0x180) =
                             (uint)(bVar34 & 1) * *(int *)local_480.hit |
                             (uint)!(bool)(bVar34 & 1) * *(int *)(local_480.ray + 0x180);
                        *(uint *)(local_480.ray + 0x184) =
                             (uint)bVar46 * iVar27 | (uint)!bVar46 * *(int *)(local_480.ray + 0x184)
                        ;
                        *(uint *)(local_480.ray + 0x188) =
                             (uint)bVar47 * iVar28 | (uint)!bVar47 * *(int *)(local_480.ray + 0x188)
                        ;
                        *(uint *)(local_480.ray + 0x18c) =
                             (uint)bVar44 * iVar29 | (uint)!bVar44 * *(int *)(local_480.ray + 0x18c)
                        ;
                        *(uint *)(local_480.ray + 400) =
                             (uint)bVar45 * iVar30 | (uint)!bVar45 * *(int *)(local_480.ray + 400);
                        *(uint *)(local_480.ray + 0x194) =
                             (uint)bVar12 * iVar31 | (uint)!bVar12 * *(int *)(local_480.ray + 0x194)
                        ;
                        *(uint *)(local_480.ray + 0x198) =
                             (uint)bVar13 * iVar32 | (uint)!bVar13 * *(int *)(local_480.ray + 0x198)
                        ;
                        *(uint *)(local_480.ray + 0x19c) =
                             (uint)bVar14 * iVar33 | (uint)!bVar14 * *(int *)(local_480.ray + 0x19c)
                        ;
                        iVar27 = *(int *)(local_480.hit + 0x24);
                        iVar28 = *(int *)(local_480.hit + 0x28);
                        iVar29 = *(int *)(local_480.hit + 0x2c);
                        iVar30 = *(int *)(local_480.hit + 0x30);
                        iVar31 = *(int *)(local_480.hit + 0x34);
                        iVar32 = *(int *)(local_480.hit + 0x38);
                        iVar33 = *(int *)(local_480.hit + 0x3c);
                        bVar46 = (bool)((byte)(uVar42 >> 1) & 1);
                        bVar47 = (bool)((byte)(uVar42 >> 2) & 1);
                        bVar44 = (bool)((byte)(uVar42 >> 3) & 1);
                        bVar45 = (bool)((byte)(uVar42 >> 4) & 1);
                        bVar12 = (bool)((byte)(uVar42 >> 5) & 1);
                        bVar13 = (bool)((byte)(uVar42 >> 6) & 1);
                        bVar14 = SUB81(uVar42 >> 7,0);
                        *(uint *)(local_480.ray + 0x1a0) =
                             (uint)(bVar34 & 1) * *(int *)(local_480.hit + 0x20) |
                             (uint)!(bool)(bVar34 & 1) * *(int *)(local_480.ray + 0x1a0);
                        *(uint *)(local_480.ray + 0x1a4) =
                             (uint)bVar46 * iVar27 | (uint)!bVar46 * *(int *)(local_480.ray + 0x1a4)
                        ;
                        *(uint *)(local_480.ray + 0x1a8) =
                             (uint)bVar47 * iVar28 | (uint)!bVar47 * *(int *)(local_480.ray + 0x1a8)
                        ;
                        *(uint *)(local_480.ray + 0x1ac) =
                             (uint)bVar44 * iVar29 | (uint)!bVar44 * *(int *)(local_480.ray + 0x1ac)
                        ;
                        *(uint *)(local_480.ray + 0x1b0) =
                             (uint)bVar45 * iVar30 | (uint)!bVar45 * *(int *)(local_480.ray + 0x1b0)
                        ;
                        *(uint *)(local_480.ray + 0x1b4) =
                             (uint)bVar12 * iVar31 | (uint)!bVar12 * *(int *)(local_480.ray + 0x1b4)
                        ;
                        *(uint *)(local_480.ray + 0x1b8) =
                             (uint)bVar13 * iVar32 | (uint)!bVar13 * *(int *)(local_480.ray + 0x1b8)
                        ;
                        *(uint *)(local_480.ray + 0x1bc) =
                             (uint)bVar14 * iVar33 | (uint)!bVar14 * *(int *)(local_480.ray + 0x1bc)
                        ;
                        iVar27 = *(int *)(local_480.hit + 0x44);
                        iVar28 = *(int *)(local_480.hit + 0x48);
                        iVar29 = *(int *)(local_480.hit + 0x4c);
                        iVar30 = *(int *)(local_480.hit + 0x50);
                        iVar31 = *(int *)(local_480.hit + 0x54);
                        iVar32 = *(int *)(local_480.hit + 0x58);
                        iVar33 = *(int *)(local_480.hit + 0x5c);
                        bVar46 = (bool)((byte)(uVar42 >> 1) & 1);
                        bVar47 = (bool)((byte)(uVar42 >> 2) & 1);
                        bVar44 = (bool)((byte)(uVar42 >> 3) & 1);
                        bVar45 = (bool)((byte)(uVar42 >> 4) & 1);
                        bVar12 = (bool)((byte)(uVar42 >> 5) & 1);
                        bVar13 = (bool)((byte)(uVar42 >> 6) & 1);
                        bVar14 = SUB81(uVar42 >> 7,0);
                        *(uint *)(local_480.ray + 0x1c0) =
                             (uint)(bVar34 & 1) * *(int *)(local_480.hit + 0x40) |
                             (uint)!(bool)(bVar34 & 1) * *(int *)(local_480.ray + 0x1c0);
                        *(uint *)(local_480.ray + 0x1c4) =
                             (uint)bVar46 * iVar27 | (uint)!bVar46 * *(int *)(local_480.ray + 0x1c4)
                        ;
                        *(uint *)(local_480.ray + 0x1c8) =
                             (uint)bVar47 * iVar28 | (uint)!bVar47 * *(int *)(local_480.ray + 0x1c8)
                        ;
                        *(uint *)(local_480.ray + 0x1cc) =
                             (uint)bVar44 * iVar29 | (uint)!bVar44 * *(int *)(local_480.ray + 0x1cc)
                        ;
                        *(uint *)(local_480.ray + 0x1d0) =
                             (uint)bVar45 * iVar30 | (uint)!bVar45 * *(int *)(local_480.ray + 0x1d0)
                        ;
                        *(uint *)(local_480.ray + 0x1d4) =
                             (uint)bVar12 * iVar31 | (uint)!bVar12 * *(int *)(local_480.ray + 0x1d4)
                        ;
                        *(uint *)(local_480.ray + 0x1d8) =
                             (uint)bVar13 * iVar32 | (uint)!bVar13 * *(int *)(local_480.ray + 0x1d8)
                        ;
                        *(uint *)(local_480.ray + 0x1dc) =
                             (uint)bVar14 * iVar33 | (uint)!bVar14 * *(int *)(local_480.ray + 0x1dc)
                        ;
                        iVar27 = *(int *)(local_480.hit + 100);
                        iVar28 = *(int *)(local_480.hit + 0x68);
                        iVar29 = *(int *)(local_480.hit + 0x6c);
                        iVar30 = *(int *)(local_480.hit + 0x70);
                        iVar31 = *(int *)(local_480.hit + 0x74);
                        iVar32 = *(int *)(local_480.hit + 0x78);
                        iVar33 = *(int *)(local_480.hit + 0x7c);
                        bVar46 = (bool)((byte)(uVar42 >> 1) & 1);
                        bVar47 = (bool)((byte)(uVar42 >> 2) & 1);
                        bVar44 = (bool)((byte)(uVar42 >> 3) & 1);
                        bVar45 = (bool)((byte)(uVar42 >> 4) & 1);
                        bVar12 = (bool)((byte)(uVar42 >> 5) & 1);
                        bVar13 = (bool)((byte)(uVar42 >> 6) & 1);
                        bVar14 = SUB81(uVar42 >> 7,0);
                        *(uint *)(local_480.ray + 0x1e0) =
                             (uint)(bVar34 & 1) * *(int *)(local_480.hit + 0x60) |
                             (uint)!(bool)(bVar34 & 1) * *(int *)(local_480.ray + 0x1e0);
                        *(uint *)(local_480.ray + 0x1e4) =
                             (uint)bVar46 * iVar27 | (uint)!bVar46 * *(int *)(local_480.ray + 0x1e4)
                        ;
                        *(uint *)(local_480.ray + 0x1e8) =
                             (uint)bVar47 * iVar28 | (uint)!bVar47 * *(int *)(local_480.ray + 0x1e8)
                        ;
                        *(uint *)(local_480.ray + 0x1ec) =
                             (uint)bVar44 * iVar29 | (uint)!bVar44 * *(int *)(local_480.ray + 0x1ec)
                        ;
                        *(uint *)(local_480.ray + 0x1f0) =
                             (uint)bVar45 * iVar30 | (uint)!bVar45 * *(int *)(local_480.ray + 0x1f0)
                        ;
                        *(uint *)(local_480.ray + 500) =
                             (uint)bVar12 * iVar31 | (uint)!bVar12 * *(int *)(local_480.ray + 500);
                        *(uint *)(local_480.ray + 0x1f8) =
                             (uint)bVar13 * iVar32 | (uint)!bVar13 * *(int *)(local_480.ray + 0x1f8)
                        ;
                        *(uint *)(local_480.ray + 0x1fc) =
                             (uint)bVar14 * iVar33 | (uint)!bVar14 * *(int *)(local_480.ray + 0x1fc)
                        ;
                        iVar27 = *(int *)(local_480.hit + 0x84);
                        iVar28 = *(int *)(local_480.hit + 0x88);
                        iVar29 = *(int *)(local_480.hit + 0x8c);
                        iVar30 = *(int *)(local_480.hit + 0x90);
                        iVar31 = *(int *)(local_480.hit + 0x94);
                        iVar32 = *(int *)(local_480.hit + 0x98);
                        iVar33 = *(int *)(local_480.hit + 0x9c);
                        bVar46 = (bool)((byte)(uVar42 >> 1) & 1);
                        bVar47 = (bool)((byte)(uVar42 >> 2) & 1);
                        bVar44 = (bool)((byte)(uVar42 >> 3) & 1);
                        bVar45 = (bool)((byte)(uVar42 >> 4) & 1);
                        bVar12 = (bool)((byte)(uVar42 >> 5) & 1);
                        bVar13 = (bool)((byte)(uVar42 >> 6) & 1);
                        bVar14 = SUB81(uVar42 >> 7,0);
                        *(uint *)(local_480.ray + 0x200) =
                             (uint)(bVar34 & 1) * *(int *)(local_480.hit + 0x80) |
                             (uint)!(bool)(bVar34 & 1) * *(int *)(local_480.ray + 0x200);
                        *(uint *)(local_480.ray + 0x204) =
                             (uint)bVar46 * iVar27 | (uint)!bVar46 * *(int *)(local_480.ray + 0x204)
                        ;
                        *(uint *)(local_480.ray + 0x208) =
                             (uint)bVar47 * iVar28 | (uint)!bVar47 * *(int *)(local_480.ray + 0x208)
                        ;
                        *(uint *)(local_480.ray + 0x20c) =
                             (uint)bVar44 * iVar29 | (uint)!bVar44 * *(int *)(local_480.ray + 0x20c)
                        ;
                        *(uint *)(local_480.ray + 0x210) =
                             (uint)bVar45 * iVar30 | (uint)!bVar45 * *(int *)(local_480.ray + 0x210)
                        ;
                        *(uint *)(local_480.ray + 0x214) =
                             (uint)bVar12 * iVar31 | (uint)!bVar12 * *(int *)(local_480.ray + 0x214)
                        ;
                        *(uint *)(local_480.ray + 0x218) =
                             (uint)bVar13 * iVar32 | (uint)!bVar13 * *(int *)(local_480.ray + 0x218)
                        ;
                        *(uint *)(local_480.ray + 0x21c) =
                             (uint)bVar14 * iVar33 | (uint)!bVar14 * *(int *)(local_480.ray + 0x21c)
                        ;
                        auVar79 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_480.hit + 0xa0));
                        *(undefined1 (*) [32])(local_480.ray + 0x220) = auVar79;
                        auVar79 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_480.hit + 0xc0));
                        *(undefined1 (*) [32])(local_480.ray + 0x240) = auVar79;
                        auVar79 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_480.hit + 0xe0));
                        *(undefined1 (*) [32])(local_480.ray + 0x260) = auVar79;
                        auVar79 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_480.hit + 0x100));
                        *(undefined1 (*) [32])(local_480.ray + 0x280) = auVar79;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar223;
                    break;
                  }
                  lVar38 = lVar38 + -1;
                } while (lVar38 != 0);
              }
            }
          }
          if ((uint)uVar36 == 0) break;
        } while( true );
      }
      uVar115 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar20._4_4_ = uVar115;
      auVar20._0_4_ = uVar115;
      auVar20._8_4_ = uVar115;
      auVar20._12_4_ = uVar115;
      auVar20._16_4_ = uVar115;
      auVar20._20_4_ = uVar115;
      auVar20._24_4_ = uVar115;
      auVar20._28_4_ = uVar115;
      uVar15 = vcmpps_avx512vl(local_1c0,auVar20,2);
      uVar43 = (uint)uVar41 & (uint)uVar15;
      uVar41 = (ulong)uVar43;
    } while (uVar43 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }